

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O1

string * __thiscall
CppGenerator::genAggLoopStringCompressed
          (string *__return_storage_ptr__,CppGenerator *this,TDNode *node,size_t currentLoop,
          size_t depth,dyn_bitset *contributingViews,size_t numOfOutViewLoops,string *resetString)

{
  pointer pvVar1;
  CppGenerator *pCVar2;
  pointer pvVar3;
  pointer pvVar4;
  unsigned_long uVar5;
  bool bVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  string *psVar9;
  TDNode *node_00;
  bool bVar10;
  long lVar11;
  iterator iVar12;
  undefined8 *puVar13;
  long *plVar14;
  long *plVar15;
  pointer puVar16;
  size_type sVar17;
  ulong *puVar18;
  ulong uVar19;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar20;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar21;
  long *plVar22;
  undefined8 *puVar23;
  size_type *psVar24;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar25;
  ulong uVar26;
  pointer pvVar27;
  size_t sVar28;
  pointer pAVar29;
  CppGenerator *pCVar30;
  undefined8 uVar31;
  _WordT *p_Var32;
  AggregateIndexes *pAVar33;
  _Alloc_hider _Var34;
  AggregateIndexes *pAVar35;
  CppGenerator *pCVar36;
  size_t sVar37;
  size_t f;
  pointer pbVar38;
  ulong uVar39;
  prod_bitset *ppVar40;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *pdVar41;
  pointer pvVar42;
  byte bVar43;
  long lVar44;
  long lVar45;
  char cVar46;
  ushort uVar47;
  byte bVar64;
  undefined1 auVar52 [12];
  undefined1 auVar53 [12];
  char cVar65;
  byte bVar66;
  char cVar67;
  byte bVar68;
  char cVar69;
  byte bVar70;
  char cVar71;
  byte bVar72;
  undefined1 auVar59 [16];
  undefined1 auVar62 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  string resetAggregates;
  string __str_2;
  string productString;
  string __str_1;
  string local;
  bitset<7UL> increasingIndexes;
  size_t thisLoopID;
  string depthString;
  prod_bitset removedFunctions;
  prod_bitset subProduct;
  size_t nextLoop;
  string local_6f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6b8;
  size_t local_698;
  ulong *local_690;
  long local_688;
  ulong local_680;
  long lStack_678;
  string *local_670;
  pointer local_668;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_660;
  _Base_bitset<1UL> local_640;
  long local_638;
  ulong local_630;
  long lStack_628;
  size_t local_620;
  char local_611;
  ulong *local_610;
  long local_608;
  ulong local_600;
  long lStack_5f8;
  size_t local_5f0;
  size_type local_5e8;
  char *local_5e0;
  uint local_5d8;
  char local_5d0 [16];
  ulong local_5c0;
  ulong *local_5b8;
  long local_5b0;
  ulong local_5a8;
  long lStack_5a0;
  undefined1 local_598 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_588;
  undefined1 local_578 [16];
  undefined1 local_568 [16];
  _WordT local_558;
  long local_4d0;
  undefined1 local_4c8 [192];
  unsigned_long local_408;
  ulong *local_400;
  long local_3f8;
  ulong local_3f0;
  long lStack_3e8;
  undefined8 *local_3e0;
  undefined8 local_3d8;
  undefined8 local_3d0;
  undefined8 uStack_3c8;
  ulong *local_3c0;
  long local_3b8;
  ulong local_3b0;
  long lStack_3a8;
  undefined8 *local_3a0;
  undefined8 local_398;
  undefined8 local_390;
  undefined8 uStack_388;
  undefined8 *local_380;
  undefined8 local_378;
  undefined8 local_370;
  undefined8 uStack_368;
  undefined8 *local_360;
  undefined8 local_358;
  undefined8 local_350;
  undefined8 uStack_348;
  ulong *local_340;
  long local_338;
  ulong local_330;
  long lStack_328;
  ulong *local_320;
  long local_318;
  ulong local_310;
  long lStack_308;
  undefined8 *local_300;
  undefined8 local_2f8;
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  undefined8 *local_2e0;
  undefined8 local_2d8;
  undefined8 local_2d0;
  undefined8 uStack_2c8;
  ulong *local_2c0;
  long local_2b8;
  ulong local_2b0;
  long lStack_2a8;
  ulong *local_2a0;
  long local_298;
  ulong local_290;
  long lStack_288;
  ulong *local_280;
  long local_278;
  ulong local_270;
  long lStack_268;
  ulong *local_260;
  long local_258;
  ulong local_250;
  long lStack_248;
  ulong *local_240;
  long local_238;
  ulong local_230;
  long lStack_228;
  long *local_220;
  long local_218;
  long local_210;
  long lStack_208;
  long *local_200;
  long local_1f8;
  long local_1f0;
  long lStack_1e8;
  long *local_1e0;
  long local_1d8;
  long local_1d0;
  long lStack_1c8;
  long *local_1c0;
  long local_1b8;
  long local_1b0;
  long lStack_1a8;
  long *local_1a0;
  long local_198;
  long local_190;
  long lStack_188;
  long *local_180;
  long local_178;
  long local_170;
  long lStack_168;
  long *local_160;
  long local_158;
  long local_150;
  long lStack_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_140;
  dyn_bitset *local_138;
  TDNode *local_130;
  ulong *local_128;
  long local_120;
  ulong local_118 [2];
  ulong *local_108;
  long local_100;
  ulong local_f8 [2];
  ulong *local_e8;
  long local_e0;
  ulong local_d8 [2];
  ulong *local_c8;
  long local_c0;
  ulong local_b8 [2];
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *local_a8;
  long *local_a0;
  long local_98;
  long local_90;
  long lStack_88;
  long *local_80;
  long local_78;
  long local_70;
  long lStack_68;
  ulong local_60;
  size_t local_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  undefined4 uVar48;
  undefined6 uVar49;
  undefined1 auVar50 [12];
  undefined1 auVar51 [12];
  undefined1 auVar54 [14];
  undefined1 auVar55 [14];
  undefined1 auVar56 [14];
  undefined1 auVar57 [14];
  undefined1 auVar58 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar63 [16];
  
  bVar43 = 0;
  pdVar41 = (this->listOfLoops).
            super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start + currentLoop;
  local_698 = depth;
  local_620 = currentLoop;
  local_138 = contributingViews;
  local_5e8 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::count(pdVar41);
  local_140 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_140;
  local_670 = __return_storage_ptr__;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  cVar46 = '\x01';
  if (9 < depth) {
    sVar37 = depth;
    cVar65 = '\x04';
    do {
      cVar46 = cVar65;
      if (sVar37 < 100) {
        cVar46 = cVar46 + -2;
        goto LAB_00251740;
      }
      if (sVar37 < 1000) {
        cVar46 = cVar46 + -1;
        goto LAB_00251740;
      }
      if (sVar37 < 10000) goto LAB_00251740;
      bVar10 = 99999 < sVar37;
      sVar37 = sVar37 / 10000;
      cVar65 = cVar46 + '\x04';
    } while (bVar10);
    cVar46 = cVar46 + '\x01';
  }
LAB_00251740:
  local_5e0 = local_5d0;
  local_130 = node;
  local_a8 = pdVar41;
  std::__cxx11::string::_M_construct((ulong)&local_5e0,cVar46);
  local_5e8 = local_5e8 + numOfOutViewLoops;
  std::__detail::__to_chars_10_impl<unsigned_long>(local_5e0,local_5d8,depth);
  pvVar1 = (this->localProductList).
           super__Vector_base<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::allocator<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar38 = pvVar1[local_620].
            super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (*(pointer *)
       ((long)&pvVar1[local_620].
               super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>.
               _M_impl.super__Vector_impl_data + 8) != pbVar38) {
    local_5c0 = local_5e8 + 3;
    sVar37 = 0;
    pCVar30 = (CppGenerator *)0x0;
    pCVar36 = this;
    do {
      sVar28 = local_620;
      local_6b8._M_dataplus._M_p = (pointer)&local_6b8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_6b8,"");
      local_668 = pbVar38 + (long)pCVar30;
      lVar44 = 0;
      lVar45 = 0;
      lVar11 = 0;
      do {
        auVar59 = *(undefined1 (*) [16])
                   ((long)(pbVar38->super__Base_bitset<24UL>)._M_w + lVar11 * 8 + sVar37);
        auVar73._0_2_ = auVar59._0_2_ >> 1;
        auVar73._2_2_ = auVar59._2_2_ >> 1;
        auVar73._4_2_ = auVar59._4_2_ >> 1;
        auVar73._6_2_ = auVar59._6_2_ >> 1;
        auVar73._8_2_ = auVar59._8_2_ >> 1;
        auVar73._10_2_ = auVar59._10_2_ >> 1;
        auVar73._12_2_ = auVar59._12_2_ >> 1;
        auVar73._14_2_ = auVar59._14_2_ >> 1;
        auVar73 = auVar73 & _DAT_002b0050;
        uVar47 = CONCAT11(auVar59[1] - auVar73[1],auVar59[0] - auVar73[0]);
        uVar48 = CONCAT13(auVar59[3] - auVar73[3],CONCAT12(auVar59[2] - auVar73[2],uVar47));
        uVar49 = CONCAT15(auVar59[5] - auVar73[5],CONCAT14(auVar59[4] - auVar73[4],uVar48));
        uVar31 = CONCAT17(auVar59[7] - auVar73[7],CONCAT16(auVar59[6] - auVar73[6],uVar49));
        auVar50._0_10_ = CONCAT19(auVar59[9] - auVar73[9],CONCAT18(auVar59[8] - auVar73[8],uVar31));
        auVar50[10] = auVar59[10] - auVar73[10];
        auVar50[0xb] = auVar59[0xb] - auVar73[0xb];
        auVar54[0xc] = auVar59[0xc] - auVar73[0xc];
        auVar54._0_12_ = auVar50;
        auVar54[0xd] = auVar59[0xd] - auVar73[0xd];
        auVar58[0xe] = auVar59[0xe] - auVar73[0xe];
        auVar58._0_14_ = auVar54;
        auVar58[0xf] = auVar59[0xf] - auVar73[0xf];
        auVar73 = auVar58 & _DAT_002b0060;
        auVar59._0_2_ = uVar47 >> 2;
        auVar59._2_2_ = (ushort)((uint)uVar48 >> 0x12);
        auVar59._4_2_ = (ushort)((uint6)uVar49 >> 0x22);
        auVar59._6_2_ = (ushort)((ulong)uVar31 >> 0x32);
        auVar59._8_2_ = (ushort)((unkuint10)auVar50._0_10_ >> 0x42);
        auVar59._10_2_ = auVar50._10_2_ >> 2;
        auVar59._12_2_ = auVar54._12_2_ >> 2;
        auVar59._14_2_ = auVar58._14_2_ >> 2;
        auVar59 = auVar59 & _DAT_002b0060;
        cVar46 = auVar59[0] + auVar73[0];
        bVar64 = auVar59[1] + auVar73[1];
        uVar47 = CONCAT11(bVar64,cVar46);
        cVar65 = auVar59[2] + auVar73[2];
        bVar66 = auVar59[3] + auVar73[3];
        uVar48 = CONCAT13(bVar66,CONCAT12(cVar65,uVar47));
        cVar67 = auVar59[4] + auVar73[4];
        bVar68 = auVar59[5] + auVar73[5];
        uVar49 = CONCAT15(bVar68,CONCAT14(cVar67,uVar48));
        cVar69 = auVar59[6] + auVar73[6];
        bVar70 = auVar59[7] + auVar73[7];
        uVar31 = CONCAT17(bVar70,CONCAT16(cVar69,uVar49));
        cVar71 = auVar59[8] + auVar73[8];
        bVar72 = auVar59[9] + auVar73[9];
        auVar51._0_10_ = CONCAT19(bVar72,CONCAT18(cVar71,uVar31));
        auVar51[10] = auVar59[10] + auVar73[10];
        auVar51[0xb] = auVar59[0xb] + auVar73[0xb];
        auVar55[0xc] = auVar59[0xc] + auVar73[0xc];
        auVar55._0_12_ = auVar51;
        auVar55[0xd] = auVar59[0xd] + auVar73[0xd];
        auVar60[0xe] = auVar59[0xe] + auVar73[0xe];
        auVar60._0_14_ = auVar55;
        auVar60[0xf] = auVar59[0xf] + auVar73[0xf];
        auVar74[0] = (char)(uVar47 >> 4) + cVar46;
        auVar74[1] = (bVar64 >> 4) + bVar64;
        auVar74[2] = (char)(ushort)((uint)uVar48 >> 0x14) + cVar65;
        auVar74[3] = (bVar66 >> 4) + bVar66;
        auVar74[4] = (char)(ushort)((uint6)uVar49 >> 0x24) + cVar67;
        auVar74[5] = (bVar68 >> 4) + bVar68;
        auVar74[6] = (char)(ushort)((ulong)uVar31 >> 0x34) + cVar69;
        auVar74[7] = (bVar70 >> 4) + bVar70;
        auVar74[8] = (char)(ushort)((unkuint10)auVar51._0_10_ >> 0x44) + cVar71;
        auVar74[9] = (bVar72 >> 4) + bVar72;
        auVar74[10] = (char)(auVar51._10_2_ >> 4) + auVar51[10];
        auVar74[0xb] = (auVar51[0xb] >> 4) + auVar51[0xb];
        auVar74[0xc] = (char)(auVar55._12_2_ >> 4) + auVar55[0xc];
        auVar74[0xd] = (auVar55[0xd] >> 4) + auVar55[0xd];
        auVar74[0xe] = (char)(auVar60._14_2_ >> 4) + auVar60[0xe];
        auVar74[0xf] = (auVar60[0xf] >> 4) + auVar60[0xf];
        auVar59 = psadbw(auVar74 & _DAT_002b0070,(undefined1  [16])0x0);
        lVar44 = lVar44 + auVar59._0_8_;
        lVar45 = lVar45 + auVar59._8_8_;
        lVar11 = lVar11 + 2;
      } while (lVar11 != 0x18);
      local_5f0 = sVar37;
      if ((ulong)(lVar45 + lVar44) < 2) {
        bVar10 = false;
      }
      else {
        memcpy(local_4c8,local_668,0xc0);
        bVar10 = false;
        memset(local_598,0,0xc0);
        do {
          lVar44 = 0;
          lVar45 = 0;
          lVar11 = 0;
          do {
            auVar59 = *(undefined1 (*) [16])(local_4c8 + lVar11 * 8);
            auVar75._0_2_ = auVar59._0_2_ >> 1;
            auVar75._2_2_ = auVar59._2_2_ >> 1;
            auVar75._4_2_ = auVar59._4_2_ >> 1;
            auVar75._6_2_ = auVar59._6_2_ >> 1;
            auVar75._8_2_ = auVar59._8_2_ >> 1;
            auVar75._10_2_ = auVar59._10_2_ >> 1;
            auVar75._12_2_ = auVar59._12_2_ >> 1;
            auVar75._14_2_ = auVar59._14_2_ >> 1;
            auVar75 = auVar75 & _DAT_002b0050;
            uVar47 = CONCAT11(auVar59[1] - auVar75[1],auVar59[0] - auVar75[0]);
            uVar48 = CONCAT13(auVar59[3] - auVar75[3],CONCAT12(auVar59[2] - auVar75[2],uVar47));
            uVar49 = CONCAT15(auVar59[5] - auVar75[5],CONCAT14(auVar59[4] - auVar75[4],uVar48));
            uVar31 = CONCAT17(auVar59[7] - auVar75[7],CONCAT16(auVar59[6] - auVar75[6],uVar49));
            auVar52._0_10_ =
                 CONCAT19(auVar59[9] - auVar75[9],CONCAT18(auVar59[8] - auVar75[8],uVar31));
            auVar52[10] = auVar59[10] - auVar75[10];
            auVar52[0xb] = auVar59[0xb] - auVar75[0xb];
            auVar56[0xc] = auVar59[0xc] - auVar75[0xc];
            auVar56._0_12_ = auVar52;
            auVar56[0xd] = auVar59[0xd] - auVar75[0xd];
            auVar61[0xe] = auVar59[0xe] - auVar75[0xe];
            auVar61._0_14_ = auVar56;
            auVar61[0xf] = auVar59[0xf] - auVar75[0xf];
            auVar59 = auVar61 & _DAT_002b0060;
            auVar62._0_2_ = uVar47 >> 2;
            auVar62._2_2_ = (ushort)((uint)uVar48 >> 0x12);
            auVar62._4_2_ = (ushort)((uint6)uVar49 >> 0x22);
            auVar62._6_2_ = (ushort)((ulong)uVar31 >> 0x32);
            auVar62._8_2_ = (ushort)((unkuint10)auVar52._0_10_ >> 0x42);
            auVar62._10_2_ = auVar52._10_2_ >> 2;
            auVar62._12_2_ = auVar56._12_2_ >> 2;
            auVar62._14_2_ = auVar61._14_2_ >> 2;
            auVar62 = auVar62 & _DAT_002b0060;
            cVar46 = auVar62[0] + auVar59[0];
            bVar64 = auVar62[1] + auVar59[1];
            uVar47 = CONCAT11(bVar64,cVar46);
            cVar65 = auVar62[2] + auVar59[2];
            bVar66 = auVar62[3] + auVar59[3];
            uVar48 = CONCAT13(bVar66,CONCAT12(cVar65,uVar47));
            cVar67 = auVar62[4] + auVar59[4];
            bVar68 = auVar62[5] + auVar59[5];
            uVar49 = CONCAT15(bVar68,CONCAT14(cVar67,uVar48));
            cVar69 = auVar62[6] + auVar59[6];
            bVar70 = auVar62[7] + auVar59[7];
            uVar31 = CONCAT17(bVar70,CONCAT16(cVar69,uVar49));
            cVar71 = auVar62[8] + auVar59[8];
            bVar72 = auVar62[9] + auVar59[9];
            auVar53._0_10_ = CONCAT19(bVar72,CONCAT18(cVar71,uVar31));
            auVar53[10] = auVar62[10] + auVar59[10];
            auVar53[0xb] = auVar62[0xb] + auVar59[0xb];
            auVar57[0xc] = auVar62[0xc] + auVar59[0xc];
            auVar57._0_12_ = auVar53;
            auVar57[0xd] = auVar62[0xd] + auVar59[0xd];
            auVar63[0xe] = auVar62[0xe] + auVar59[0xe];
            auVar63._0_14_ = auVar57;
            auVar63[0xf] = auVar62[0xf] + auVar59[0xf];
            auVar76[0] = (char)(uVar47 >> 4) + cVar46;
            auVar76[1] = (bVar64 >> 4) + bVar64;
            auVar76[2] = (char)(ushort)((uint)uVar48 >> 0x14) + cVar65;
            auVar76[3] = (bVar66 >> 4) + bVar66;
            auVar76[4] = (char)(ushort)((uint6)uVar49 >> 0x24) + cVar67;
            auVar76[5] = (bVar68 >> 4) + bVar68;
            auVar76[6] = (char)(ushort)((ulong)uVar31 >> 0x34) + cVar69;
            auVar76[7] = (bVar70 >> 4) + bVar70;
            auVar76[8] = (char)(ushort)((unkuint10)auVar53._0_10_ >> 0x44) + cVar71;
            auVar76[9] = (bVar72 >> 4) + bVar72;
            auVar76[10] = (char)(auVar53._10_2_ >> 4) + auVar53[10];
            auVar76[0xb] = (auVar53[0xb] >> 4) + auVar53[0xb];
            auVar76[0xc] = (char)(auVar57._12_2_ >> 4) + auVar57[0xc];
            auVar76[0xd] = (auVar57[0xd] >> 4) + auVar57[0xd];
            auVar76[0xe] = (char)(auVar63._14_2_ >> 4) + auVar63[0xe];
            auVar76[0xf] = (auVar63[0xf] >> 4) + auVar63[0xf];
            auVar59 = psadbw(auVar76 & _DAT_002b0070,(undefined1  [16])0x0);
            lVar44 = lVar44 + auVar59._0_8_;
            lVar45 = lVar45 + auVar59._8_8_;
            lVar11 = lVar11 + 2;
          } while (lVar11 != 0x18);
          if ((ulong)(lVar45 + lVar44) < 2) goto LAB_00251da0;
          uVar39 = 0x5dc;
          do {
            if ((*(ulong *)(local_4c8 + (uVar39 >> 6) * 8) >> (uVar39 & 0x3f) & 1) != 0)
            goto LAB_00251988;
            uVar39 = uVar39 - 1;
          } while (uVar39 != 0);
          uVar39 = 0;
LAB_00251988:
          std::bitset<1500UL>::reset((bitset<1500UL> *)local_4c8,uVar39);
          if (0x5db < uVar39) {
            std::__throw_out_of_range_fmt
                      ("%s: __position (which is %zu) >= _Nb (which is %zu)","bitset::set",uVar39,
                       0x5dc);
          }
          *(ulong *)(local_598 + (uVar39 >> 6) * 8) =
               *(ulong *)(local_598 + (uVar39 >> 6) * 8) | 1L << ((byte)uVar39 & 0x3f);
          iVar12 = std::
                   _Hashtable<std::bitset<1500UL>,_std::pair<const_std::bitset<1500UL>,_unsigned_long>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::bitset<1500UL>_>,_std::hash<std::bitset<1500UL>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   ::find(&(this->localProductMap).
                           super__Vector_base<std::unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>,_std::allocator<std::unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[sVar28]._M_h,
                          (key_type *)local_4c8);
          if ((iVar12.
               super__Node_iterator_base<std::pair<const_std::bitset<1500UL>,_unsigned_long>,_false>
               ._M_cur != (__node_type *)0x0) &&
             (*(CppGenerator **)
               ((long)iVar12.
                      super__Node_iterator_base<std::pair<const_std::bitset<1500UL>,_unsigned_long>,_false>
                      ._M_cur + 200) < pCVar30)) {
            bVar10 = true;
            pCVar36 = *(CppGenerator **)
                       ((long)iVar12.
                              super__Node_iterator_base<std::pair<const_std::bitset<1500UL>,_unsigned_long>,_false>
                              ._M_cur + 200);
          }
        } while (!bVar10);
        local_4d0 = sVar28 * 3;
        uVar39 = *(ulong *)(*(long *)&(this->localProductRemapping).
                                      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start[sVar28].
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data + (long)pCVar36 * 8);
        cVar46 = '\x01';
        if (9 < uVar39) {
          uVar19 = uVar39;
          cVar65 = '\x04';
          do {
            cVar46 = cVar65;
            if (uVar19 < 100) {
              cVar46 = cVar46 + -2;
              goto LAB_00251a90;
            }
            if (uVar19 < 1000) {
              cVar46 = cVar46 + -1;
              goto LAB_00251a90;
            }
            if (uVar19 < 10000) goto LAB_00251a90;
            bVar6 = 99999 < uVar19;
            uVar19 = uVar19 / 10000;
            cVar65 = cVar46 + '\x04';
          } while (bVar6);
          cVar46 = cVar46 + '\x01';
        }
LAB_00251a90:
        local_660._M_dataplus._M_p = (pointer)&local_660.field_2;
        std::__cxx11::string::_M_construct((ulong)&local_660,cVar46);
        std::__detail::__to_chars_10_impl<unsigned_long>
                  (local_660._M_dataplus._M_p,(uint)local_660._M_string_length,uVar39);
        std::operator+(&local_6d8,"localRegister[",&local_660);
        puVar13 = (undefined8 *)std::__cxx11::string::append((char *)&local_6d8);
        local_6f8._M_dataplus._M_p = (pointer)&local_6f8.field_2;
        puVar18 = puVar13 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar13 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar18) {
          local_6f8.field_2._M_allocated_capacity = *puVar18;
          local_6f8.field_2._8_8_ = puVar13[3];
        }
        else {
          local_6f8.field_2._M_allocated_capacity = *puVar18;
          local_6f8._M_dataplus._M_p = (pointer)*puVar13;
        }
        local_6f8._M_string_length = puVar13[1];
        *puVar13 = puVar18;
        puVar13[1] = 0;
        *(undefined1 *)(puVar13 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_6b8,(ulong)local_6f8._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_6f8._M_dataplus._M_p != &local_6f8.field_2) {
          operator_delete(local_6f8._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_6d8._M_dataplus._M_p != &local_6d8.field_2) {
          operator_delete(local_6d8._M_dataplus._M_p);
        }
        iVar12 = std::
                 _Hashtable<std::bitset<1500UL>,_std::pair<const_std::bitset<1500UL>,_unsigned_long>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::bitset<1500UL>_>,_std::hash<std::bitset<1500UL>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 ::find(&(this->localProductMap).
                         super__Vector_base<std::unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>,_std::allocator<std::unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[sVar28]._M_h,
                        (key_type *)local_598);
        if ((iVar12.
             super__Node_iterator_base<std::pair<const_std::bitset<1500UL>,_unsigned_long>,_false>.
             _M_cur == (__node_type *)0x0) ||
           (pCVar2 = *(CppGenerator **)
                      ((long)iVar12.
                             super__Node_iterator_base<std::pair<const_std::bitset<1500UL>,_unsigned_long>,_false>
                             ._M_cur + 200), pCVar30 <= pCVar2)) {
          genProductString_abi_cxx11_(&local_6f8,this,local_130,local_138,(prod_bitset *)local_598);
          std::__cxx11::string::_M_append((char *)&local_6b8,(ulong)local_6f8._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_6f8._M_dataplus._M_p != &local_6f8.field_2) {
            operator_delete(local_6f8._M_dataplus._M_p);
          }
        }
        else {
          uVar39 = *(ulong *)(*(long *)((long)&(((this->localProductRemapping).
                                                 super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)->
                                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                               )._M_impl.super__Vector_impl_data + local_4d0 * 8) +
                             (long)pCVar2 * 8);
          cVar46 = '\x01';
          if (9 < uVar39) {
            uVar19 = uVar39;
            cVar65 = '\x04';
            do {
              cVar46 = cVar65;
              if (uVar19 < 100) {
                cVar46 = cVar46 + -2;
                goto LAB_00251c8b;
              }
              if (uVar19 < 1000) {
                cVar46 = cVar46 + -1;
                goto LAB_00251c8b;
              }
              if (uVar19 < 10000) goto LAB_00251c8b;
              bVar6 = 99999 < uVar19;
              uVar19 = uVar19 / 10000;
              cVar65 = cVar46 + '\x04';
            } while (bVar6);
            cVar46 = cVar46 + '\x01';
          }
LAB_00251c8b:
          local_6f8._M_dataplus._M_p = (pointer)&local_6f8.field_2;
          std::__cxx11::string::_M_construct((ulong)&local_6f8,cVar46);
          std::__detail::__to_chars_10_impl<unsigned_long>
                    (local_6f8._M_dataplus._M_p,(uint)local_6f8._M_string_length,uVar39);
          std::__cxx11::string::operator=((string *)&local_660,(string *)&local_6f8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_6f8._M_dataplus._M_p != &local_6f8.field_2) {
            operator_delete(local_6f8._M_dataplus._M_p);
          }
          std::operator+(&local_6d8,"localRegister[",&local_660);
          puVar13 = (undefined8 *)std::__cxx11::string::append((char *)&local_6d8);
          local_6f8._M_dataplus._M_p = (pointer)&local_6f8.field_2;
          puVar18 = puVar13 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar13 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar18) {
            local_6f8.field_2._M_allocated_capacity = *puVar18;
            local_6f8.field_2._8_8_ = puVar13[3];
          }
          else {
            local_6f8.field_2._M_allocated_capacity = *puVar18;
            local_6f8._M_dataplus._M_p = (pointer)*puVar13;
          }
          local_6f8._M_string_length = puVar13[1];
          *puVar13 = puVar18;
          puVar13[1] = 0;
          *(undefined1 *)(puVar13 + 2) = 0;
          std::__cxx11::string::_M_append((char *)&local_6b8,(ulong)local_6f8._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_6f8._M_dataplus._M_p != &local_6f8.field_2) {
            operator_delete(local_6f8._M_dataplus._M_p);
          }
          pCVar36 = pCVar2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_6d8._M_dataplus._M_p != &local_6d8.field_2) {
            operator_delete(local_6d8._M_dataplus._M_p);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_660._M_dataplus._M_p != &local_660.field_2) {
          operator_delete(local_660._M_dataplus._M_p);
        }
      }
LAB_00251da0:
      paVar25 = &local_6d8.field_2;
      if (!bVar10) {
        genProductString_abi_cxx11_((string *)local_4c8,this,local_130,local_138,local_668);
        std::__cxx11::string::_M_append((char *)&local_6b8,local_4c8._0_8_);
        if ((undefined1 *)local_4c8._0_8_ != local_4c8 + 0x10) {
          operator_delete((void *)local_4c8._0_8_);
        }
      }
      local_640._M_w = (_WordT)&local_630;
      std::__cxx11::string::_M_construct
                ((ulong)&local_640,((char)local_698 + (char)local_5c0) * '\x03');
      plVar14 = (long *)std::__cxx11::string::append((char *)&local_640);
      puVar18 = (ulong *)(plVar14 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar14 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar18) {
        local_6d8.field_2._M_allocated_capacity = *puVar18;
        local_6d8.field_2._8_8_ = plVar14[3];
        local_6d8._M_dataplus._M_p = (pointer)paVar25;
      }
      else {
        local_6d8.field_2._M_allocated_capacity = *puVar18;
        local_6d8._M_dataplus._M_p = (pointer)*plVar14;
      }
      local_6d8._M_string_length = plVar14[1];
      *plVar14 = (long)puVar18;
      plVar14[1] = 0;
      *(undefined1 *)(plVar14 + 2) = 0;
      uVar39 = this->productCounter;
      cVar46 = '\x01';
      if (9 < uVar39) {
        uVar19 = uVar39;
        cVar65 = '\x04';
        do {
          cVar46 = cVar65;
          if (uVar19 < 100) {
            cVar46 = cVar46 + -2;
            goto LAB_00251efc;
          }
          if (uVar19 < 1000) {
            cVar46 = cVar46 + -1;
            goto LAB_00251efc;
          }
          if (uVar19 < 10000) goto LAB_00251efc;
          bVar10 = 99999 < uVar19;
          uVar19 = uVar19 / 10000;
          cVar65 = cVar46 + '\x04';
        } while (bVar10);
        cVar46 = cVar46 + '\x01';
      }
LAB_00251efc:
      local_690 = &local_680;
      std::__cxx11::string::_M_construct((ulong)&local_690,cVar46);
      std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_690,(uint)local_688,uVar39);
      uVar31 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6d8._M_dataplus._M_p != paVar25) {
        uVar31 = local_6d8.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar31 < local_688 + local_6d8._M_string_length) {
        uVar39 = 0xf;
        if (local_690 != &local_680) {
          uVar39 = local_680;
        }
        if (uVar39 < local_688 + local_6d8._M_string_length) goto LAB_00251f87;
        puVar13 = (undefined8 *)
                  std::__cxx11::string::replace
                            ((ulong)&local_690,0,(char *)0x0,(ulong)local_6d8._M_dataplus._M_p);
      }
      else {
LAB_00251f87:
        puVar13 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_6d8,(ulong)local_690)
        ;
      }
      puVar18 = puVar13 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar13 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar18) {
        local_6f8.field_2._M_allocated_capacity = *puVar18;
        local_6f8.field_2._8_8_ = puVar13[3];
        local_6f8._M_dataplus._M_p = (pointer)&local_6f8.field_2;
      }
      else {
        local_6f8.field_2._M_allocated_capacity = *puVar18;
        local_6f8._M_dataplus._M_p = (pointer)*puVar13;
      }
      local_6f8._M_string_length = puVar13[1];
      *puVar13 = puVar18;
      puVar13[1] = 0;
      *(undefined1 *)puVar18 = 0;
      puVar13 = (undefined8 *)std::__cxx11::string::append((char *)&local_6f8);
      puVar18 = puVar13 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar13 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar18) {
        local_660.field_2._M_allocated_capacity = *puVar18;
        local_660.field_2._8_8_ = puVar13[3];
        local_660._M_dataplus._M_p = (pointer)&local_660.field_2;
      }
      else {
        local_660.field_2._M_allocated_capacity = *puVar18;
        local_660._M_dataplus._M_p = (pointer)*puVar13;
      }
      local_660._M_string_length = puVar13[1];
      *puVar13 = puVar18;
      puVar13[1] = 0;
      *(undefined1 *)(puVar13 + 2) = 0;
      plVar14 = (long *)std::__cxx11::string::_M_append
                                  ((char *)&local_660,(ulong)local_6b8._M_dataplus._M_p);
      local_598._0_8_ = &local_588;
      paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar14 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar14 == paVar20) {
        local_588 = *paVar20;
      }
      else {
        local_588._M_allocated_capacity = paVar20->_M_allocated_capacity;
        local_598._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*plVar14;
      }
      local_598._8_8_ = plVar14[1];
      *plVar14 = (long)paVar20;
      plVar14[1] = 0;
      *(undefined1 *)(plVar14 + 2) = 0;
      puVar13 = (undefined8 *)std::__cxx11::string::append(local_598);
      local_4c8._0_8_ = local_4c8 + 0x10;
      p_Var32 = puVar13 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar13 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)p_Var32) {
        local_4c8._16_8_ = *p_Var32;
        local_4c8._24_8_ = puVar13[3];
      }
      else {
        local_4c8._16_8_ = *p_Var32;
        local_4c8._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*puVar13;
      }
      local_4c8._8_8_ = puVar13[1];
      *puVar13 = p_Var32;
      puVar13[1] = 0;
      *(undefined1 *)(puVar13 + 2) = 0;
      std::__cxx11::string::_M_append((char *)local_670,local_4c8._0_8_);
      if ((undefined1 *)local_4c8._0_8_ != local_4c8 + 0x10) {
        operator_delete((void *)local_4c8._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_598._0_8_ != &local_588) {
        operator_delete((void *)local_598._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_660._M_dataplus._M_p != &local_660.field_2) {
        operator_delete(local_660._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6f8._M_dataplus._M_p != &local_6f8.field_2) {
        operator_delete(local_6f8._M_dataplus._M_p);
      }
      if (local_690 != &local_680) {
        operator_delete(local_690);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6d8._M_dataplus._M_p != paVar25) {
        operator_delete(local_6d8._M_dataplus._M_p);
      }
      if ((ulong *)local_640._M_w != &local_630) {
        operator_delete((void *)local_640._M_w);
      }
      sVar37 = local_5f0;
      *(size_t *)
       (*(long *)&(this->localProductRemapping).
                  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[local_620].
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data + (long)pCVar30 * 8) = this->productCounter;
      this->productCounter = this->productCounter + 1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6b8._M_dataplus._M_p != &local_6b8.field_2) {
        operator_delete(local_6b8._M_dataplus._M_p);
      }
      pCVar30 = (CppGenerator *)((long)&(pCVar30->super_CodeGenerator)._vptr_CodeGenerator + 1);
      pvVar1 = (this->localProductList).
               super__Vector_base<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::allocator<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pbVar38 = pvVar1[local_620].
                super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>.
                _M_impl.super__Vector_impl_data._M_start;
      sVar37 = sVar37 + 0xc0;
    } while (pCVar30 < (CppGenerator *)
                       (((long)*(pointer *)
                                ((long)&pvVar1[local_620].
                                        super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
                                        ._M_impl.super__Vector_impl_data + 8) - (long)pbVar38 >> 6)
                       * -0x5555555555555555));
  }
  pvVar3 = (this->viewProductList).
           super__Vector_base<std::vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>,_std::allocator<std::vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (*(pointer *)
       ((long)&pvVar3[local_620].
               super__Vector_base<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>
               ._M_impl.super__Vector_impl_data + 8) !=
      pvVar3[local_620].
      super__Vector_base<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    paVar20 = &local_660.field_2;
    paVar25 = &local_6b8.field_2;
    local_5f0 = local_5e8 + 3;
    ppVar40 = (prod_bitset *)0x0;
    do {
      sVar37 = local_620;
      local_4c8._0_8_ = local_4c8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_4c8,"");
      lVar11 = *(long *)&(this->viewProductList).
                         super__Vector_base<std::vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>,_std::allocator<std::vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[sVar37].
                         super__Vector_base<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>
                         ._M_impl.super__Vector_impl_data;
      plVar22 = *(long **)(lVar11 + 8 + (long)ppVar40 * 0x18);
      local_668 = ppVar40;
      for (plVar14 = *(long **)(lVar11 + (long)ppVar40 * 0x18); plVar14 != plVar22;
          plVar14 = plVar14 + 2) {
        std::operator+(&local_6f8,"aggregates_",this->viewName + *plVar14);
        puVar13 = (undefined8 *)std::__cxx11::string::append((char *)&local_6f8);
        puVar18 = puVar13 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar13 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar18) {
          local_660.field_2._M_allocated_capacity = *puVar18;
          local_660.field_2._8_8_ = puVar13[3];
          local_660._M_dataplus._M_p = (pointer)paVar20;
        }
        else {
          local_660.field_2._M_allocated_capacity = *puVar18;
          local_660._M_dataplus._M_p = (pointer)*puVar13;
        }
        local_660._M_string_length = puVar13[1];
        *puVar13 = puVar18;
        puVar13[1] = 0;
        *(undefined1 *)(puVar13 + 2) = 0;
        uVar39 = plVar14[1];
        cVar46 = '\x01';
        if (9 < uVar39) {
          uVar19 = uVar39;
          cVar65 = '\x04';
          do {
            cVar46 = cVar65;
            if (uVar19 < 100) {
              cVar46 = cVar46 + -2;
              goto LAB_002523f2;
            }
            if (uVar19 < 1000) {
              cVar46 = cVar46 + -1;
              goto LAB_002523f2;
            }
            if (uVar19 < 10000) goto LAB_002523f2;
            bVar10 = 99999 < uVar19;
            uVar19 = uVar19 / 10000;
            cVar65 = cVar46 + '\x04';
          } while (bVar10);
          cVar46 = cVar46 + '\x01';
        }
LAB_002523f2:
        local_6d8._M_dataplus._M_p = (pointer)&local_6d8.field_2;
        std::__cxx11::string::_M_construct((ulong)&local_6d8,cVar46);
        std::__detail::__to_chars_10_impl<unsigned_long>
                  (local_6d8._M_dataplus._M_p,(uint)local_6d8._M_string_length,uVar39);
        uVar31 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_660._M_dataplus._M_p != paVar20) {
          uVar31 = local_660.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar31 < local_6d8._M_string_length + local_660._M_string_length) {
          uVar31 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_6d8._M_dataplus._M_p != &local_6d8.field_2) {
            uVar31 = local_6d8.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar31 < local_6d8._M_string_length + local_660._M_string_length)
          goto LAB_0025246b;
          puVar13 = (undefined8 *)
                    std::__cxx11::string::replace
                              ((ulong)&local_6d8,0,(char *)0x0,(ulong)local_660._M_dataplus._M_p);
        }
        else {
LAB_0025246b:
          puVar13 = (undefined8 *)
                    std::__cxx11::string::_M_append
                              ((char *)&local_660,(ulong)local_6d8._M_dataplus._M_p);
        }
        puVar18 = puVar13 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar13 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar18) {
          local_6b8.field_2._M_allocated_capacity = *puVar18;
          local_6b8.field_2._8_8_ = puVar13[3];
          local_6b8._M_dataplus._M_p = (pointer)paVar25;
        }
        else {
          local_6b8.field_2._M_allocated_capacity = *puVar18;
          local_6b8._M_dataplus._M_p = (pointer)*puVar13;
        }
        local_6b8._M_string_length = puVar13[1];
        *puVar13 = puVar18;
        puVar13[1] = 0;
        *(undefined1 *)puVar18 = 0;
        plVar15 = (long *)std::__cxx11::string::append((char *)&local_6b8);
        paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar15 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar15 == paVar21) {
          local_588 = *paVar21;
          local_598._0_8_ = &local_588;
        }
        else {
          local_588._M_allocated_capacity = paVar21->_M_allocated_capacity;
          local_598._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*plVar15;
        }
        local_598._8_8_ = plVar15[1];
        *plVar15 = (long)paVar21;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        std::__cxx11::string::_M_append(local_4c8,local_598._0_8_);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_598._0_8_ != &local_588) {
          operator_delete((void *)local_598._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_6b8._M_dataplus._M_p != paVar25) {
          operator_delete(local_6b8._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_6d8._M_dataplus._M_p != &local_6d8.field_2) {
          operator_delete(local_6d8._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_660._M_dataplus._M_p != paVar20) {
          operator_delete(local_660._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_6f8._M_dataplus._M_p != &local_6f8.field_2) {
          operator_delete(local_6f8._M_dataplus._M_p);
        }
      }
      std::__cxx11::string::pop_back();
      local_640._M_w = (_WordT)&local_630;
      std::__cxx11::string::_M_construct
                ((ulong)&local_640,((char)local_698 + (char)local_5f0) * '\x03');
      puVar13 = (undefined8 *)std::__cxx11::string::append((char *)&local_640);
      local_6d8._M_dataplus._M_p = (pointer)&local_6d8.field_2;
      puVar18 = puVar13 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar13 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar18) {
        local_6d8.field_2._M_allocated_capacity = *puVar18;
        local_6d8.field_2._8_8_ = puVar13[3];
      }
      else {
        local_6d8.field_2._M_allocated_capacity = *puVar18;
        local_6d8._M_dataplus._M_p = (pointer)*puVar13;
      }
      local_6d8._M_string_length = puVar13[1];
      *puVar13 = puVar18;
      puVar13[1] = 0;
      *(undefined1 *)(puVar13 + 2) = 0;
      uVar39 = this->viewCounter;
      cVar46 = '\x01';
      if (9 < uVar39) {
        uVar19 = uVar39;
        cVar65 = '\x04';
        do {
          cVar46 = cVar65;
          if (uVar19 < 100) {
            cVar46 = cVar46 + -2;
            goto LAB_002526bc;
          }
          if (uVar19 < 1000) {
            cVar46 = cVar46 + -1;
            goto LAB_002526bc;
          }
          if (uVar19 < 10000) goto LAB_002526bc;
          bVar10 = 99999 < uVar19;
          uVar19 = uVar19 / 10000;
          cVar65 = cVar46 + '\x04';
        } while (bVar10);
        cVar46 = cVar46 + '\x01';
      }
LAB_002526bc:
      local_690 = &local_680;
      std::__cxx11::string::_M_construct((ulong)&local_690,cVar46);
      std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_690,(uint)local_688,uVar39);
      uVar31 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6d8._M_dataplus._M_p != &local_6d8.field_2) {
        uVar31 = local_6d8.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar31 < local_688 + local_6d8._M_string_length) {
        uVar39 = 0xf;
        if (local_690 != &local_680) {
          uVar39 = local_680;
        }
        if (uVar39 < local_688 + local_6d8._M_string_length) goto LAB_0025273c;
        puVar13 = (undefined8 *)
                  std::__cxx11::string::replace
                            ((ulong)&local_690,0,(char *)0x0,(ulong)local_6d8._M_dataplus._M_p);
      }
      else {
LAB_0025273c:
        puVar13 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_6d8,(ulong)local_690)
        ;
      }
      local_6f8._M_dataplus._M_p = (pointer)&local_6f8.field_2;
      puVar18 = puVar13 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar13 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar18) {
        local_6f8.field_2._M_allocated_capacity = *puVar18;
        local_6f8.field_2._8_8_ = puVar13[3];
      }
      else {
        local_6f8.field_2._M_allocated_capacity = *puVar18;
        local_6f8._M_dataplus._M_p = (pointer)*puVar13;
      }
      local_6f8._M_string_length = puVar13[1];
      *puVar13 = puVar18;
      puVar13[1] = 0;
      *(undefined1 *)puVar18 = 0;
      puVar13 = (undefined8 *)std::__cxx11::string::append((char *)&local_6f8);
      puVar18 = puVar13 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar13 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar18) {
        local_660.field_2._M_allocated_capacity = *puVar18;
        local_660.field_2._8_8_ = puVar13[3];
        local_660._M_dataplus._M_p = (pointer)paVar20;
      }
      else {
        local_660.field_2._M_allocated_capacity = *puVar18;
        local_660._M_dataplus._M_p = (pointer)*puVar13;
      }
      local_660._M_string_length = puVar13[1];
      *puVar13 = puVar18;
      puVar13[1] = 0;
      *(undefined1 *)(puVar13 + 2) = 0;
      puVar13 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_660,local_4c8._0_8_);
      puVar18 = puVar13 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar13 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar18) {
        local_6b8.field_2._M_allocated_capacity = *puVar18;
        local_6b8.field_2._8_8_ = puVar13[3];
        local_6b8._M_dataplus._M_p = (pointer)paVar25;
      }
      else {
        local_6b8.field_2._M_allocated_capacity = *puVar18;
        local_6b8._M_dataplus._M_p = (pointer)*puVar13;
      }
      local_6b8._M_string_length = puVar13[1];
      *puVar13 = puVar18;
      puVar13[1] = 0;
      *(undefined1 *)(puVar13 + 2) = 0;
      plVar14 = (long *)std::__cxx11::string::append((char *)&local_6b8);
      paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar14 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar14 == paVar21) {
        local_588 = *paVar21;
        local_598._0_8_ = &local_588;
      }
      else {
        local_588._M_allocated_capacity = paVar21->_M_allocated_capacity;
        local_598._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*plVar14;
      }
      local_598._8_8_ = plVar14[1];
      *plVar14 = (long)paVar21;
      plVar14[1] = 0;
      *(undefined1 *)(plVar14 + 2) = 0;
      std::__cxx11::string::_M_append((char *)local_670,local_598._0_8_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_598._0_8_ != &local_588) {
        operator_delete((void *)local_598._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6b8._M_dataplus._M_p != paVar25) {
        operator_delete(local_6b8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_660._M_dataplus._M_p != paVar20) {
        operator_delete(local_660._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6f8._M_dataplus._M_p != &local_6f8.field_2) {
        operator_delete(local_6f8._M_dataplus._M_p);
      }
      if (local_690 != &local_680) {
        operator_delete(local_690);
      }
      pbVar38 = local_668;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6d8._M_dataplus._M_p != &local_6d8.field_2) {
        operator_delete(local_6d8._M_dataplus._M_p);
      }
      if ((ulong *)local_640._M_w != &local_630) {
        operator_delete((void *)local_640._M_w);
      }
      *(size_t *)
       (*(long *)&(this->viewProductRemapping).
                  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[local_620].
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data + (long)pbVar38 * 8) = this->viewCounter;
      this->viewCounter = this->viewCounter + 1;
      if ((undefined1 *)local_4c8._0_8_ != local_4c8 + 0x10) {
        operator_delete((void *)local_4c8._0_8_);
      }
      pvVar3 = (this->viewProductList).
               super__Vector_base<std::vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>,_std::allocator<std::vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      ppVar40 = (prod_bitset *)((long)(pbVar38->super__Base_bitset<24UL>)._M_w + 1);
    } while (ppVar40 < (prod_bitset *)
                       (((long)*(pointer *)
                                ((long)&pvVar3[local_620].
                                        super__Vector_base<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>
                                        ._M_impl.super__Vector_impl_data + 8) -
                         *(long *)&pvVar3[local_620].
                                   super__Vector_base<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data >> 3) * -0x5555555555555555));
  }
  pvVar4 = (this->nextLoopsPerLoop).
           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar16 = pvVar4[local_620].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (*(pointer *)
       ((long)&pvVar4[local_620].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data + 8) != puVar16) {
    local_668 = (pointer)(local_5e8 + 3);
    local_4d0 = local_5e8 + 4;
    uVar39 = 0;
    pdVar41 = local_a8;
    do {
      uVar5 = puVar16[uVar39];
      local_408 = uVar5;
      boost::operator&((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)local_4c8,
                       (this->listOfLoops).
                       super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar5,pdVar41);
      bVar10 = boost::operator==((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                                 local_4c8,pdVar41);
      node_00 = local_130;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4c8._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete((void *)local_4c8._0_8_);
      }
      if (!bVar10) break;
      local_611 = bVar10;
      local_60 = uVar39;
      sVar17 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::m_do_find_from
                         ((this->viewsPerLoop).
                          super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + uVar5,0);
      local_6b8._M_dataplus._M_p = (pointer)&local_6b8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_6b8,"","");
      local_660._M_dataplus._M_p = (pointer)&local_660.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_660,"","");
      sVar37 = QueryCompiler::numberOfViews
                         ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr);
      if (sVar17 < sVar37) {
        local_50[0] = local_40;
        std::__cxx11::string::_M_construct
                  ((ulong)local_50,((char)local_698 + (char)local_668) * '\x03');
        plVar14 = (long *)std::__cxx11::string::append((char *)local_50);
        local_a0 = &local_90;
        plVar22 = plVar14 + 2;
        if ((long *)*plVar14 == plVar22) {
          local_90 = *plVar22;
          lStack_88 = plVar14[3];
        }
        else {
          local_90 = *plVar22;
          local_a0 = (long *)*plVar14;
        }
        local_98 = plVar14[1];
        *plVar14 = (long)plVar22;
        plVar14[1] = 0;
        *(undefined1 *)(plVar14 + 2) = 0;
        plVar14 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&local_a0,
                                     (ulong)this->viewName[sVar17]._M_dataplus._M_p);
        local_80 = &local_70;
        plVar22 = plVar14 + 2;
        if ((long *)*plVar14 == plVar22) {
          local_70 = *plVar22;
          lStack_68 = plVar14[3];
        }
        else {
          local_70 = *plVar22;
          local_80 = (long *)*plVar14;
        }
        local_78 = plVar14[1];
        *plVar14 = (long)plVar22;
        plVar14[1] = 0;
        *(undefined1 *)(plVar14 + 2) = 0;
        plVar14 = (long *)std::__cxx11::string::append((char *)&local_80);
        local_2a0 = &local_290;
        puVar18 = (ulong *)(plVar14 + 2);
        if ((ulong *)*plVar14 == puVar18) {
          local_290 = *puVar18;
          lStack_288 = plVar14[3];
        }
        else {
          local_290 = *puVar18;
          local_2a0 = (ulong *)*plVar14;
        }
        local_298 = plVar14[1];
        *plVar14 = (long)puVar18;
        plVar14[1] = 0;
        *(undefined1 *)(plVar14 + 2) = 0;
        plVar14 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&local_2a0,
                                     (ulong)this->viewName[sVar17]._M_dataplus._M_p);
        local_280 = &local_270;
        puVar18 = (ulong *)(plVar14 + 2);
        if ((ulong *)*plVar14 == puVar18) {
          local_270 = *puVar18;
          lStack_268 = plVar14[3];
        }
        else {
          local_270 = *puVar18;
          local_280 = (ulong *)*plVar14;
        }
        local_278 = plVar14[1];
        *plVar14 = (long)puVar18;
        plVar14[1] = 0;
        *(undefined1 *)(plVar14 + 2) = 0;
        plVar14 = (long *)std::__cxx11::string::append((char *)&local_280);
        local_260 = &local_250;
        puVar18 = (ulong *)(plVar14 + 2);
        if ((ulong *)*plVar14 == puVar18) {
          local_250 = *puVar18;
          lStack_248 = plVar14[3];
        }
        else {
          local_250 = *puVar18;
          local_260 = (ulong *)*plVar14;
        }
        local_258 = plVar14[1];
        *plVar14 = (long)puVar18;
        plVar14[1] = 0;
        *(undefined1 *)(plVar14 + 2) = 0;
        plVar14 = (long *)std::__cxx11::string::_M_append((char *)&local_260,(ulong)local_5e0);
        local_160 = &local_150;
        plVar22 = plVar14 + 2;
        if ((long *)*plVar14 == plVar22) {
          local_150 = *plVar22;
          lStack_148 = plVar14[3];
        }
        else {
          local_150 = *plVar22;
          local_160 = (long *)*plVar14;
        }
        local_158 = plVar14[1];
        *plVar14 = (long)plVar22;
        plVar14[1] = 0;
        *(undefined1 *)(plVar14 + 2) = 0;
        puVar13 = (undefined8 *)std::__cxx11::string::append((char *)&local_160);
        puVar18 = puVar13 + 2;
        if ((ulong *)*puVar13 == puVar18) {
          local_230 = *puVar18;
          lStack_228 = puVar13[3];
          local_240 = &local_230;
        }
        else {
          local_230 = *puVar18;
          local_240 = (ulong *)*puVar13;
        }
        local_238 = puVar13[1];
        *puVar13 = puVar18;
        puVar13[1] = 0;
        *(undefined1 *)(puVar13 + 2) = 0;
        local_c8 = local_b8;
        std::__cxx11::string::_M_construct
                  ((ulong)&local_c8,((char)local_698 + (char)local_668) * '\x03');
        uVar39 = 0xf;
        if (local_240 != &local_230) {
          uVar39 = local_230;
        }
        if (uVar39 < (ulong)(local_c0 + local_238)) {
          uVar39 = 0xf;
          if (local_c8 != local_b8) {
            uVar39 = local_b8[0];
          }
          if (uVar39 < (ulong)(local_c0 + local_238)) goto LAB_0025325d;
          puVar13 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_c8,0,(char *)0x0,(ulong)local_240);
        }
        else {
LAB_0025325d:
          puVar13 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_240,(ulong)local_c8);
        }
        puVar23 = puVar13 + 2;
        if ((undefined8 *)*puVar13 == puVar23) {
          local_350 = *puVar23;
          uStack_348 = puVar13[3];
          local_360 = &local_350;
        }
        else {
          local_350 = *puVar23;
          local_360 = (undefined8 *)*puVar13;
        }
        local_358 = puVar13[1];
        *puVar13 = puVar23;
        puVar13[1] = 0;
        *(undefined1 *)puVar23 = 0;
        puVar13 = (undefined8 *)std::__cxx11::string::append((char *)&local_360);
        local_220 = &local_210;
        plVar14 = puVar13 + 2;
        if ((long *)*puVar13 == plVar14) {
          local_210 = *plVar14;
          lStack_208 = puVar13[3];
        }
        else {
          local_210 = *plVar14;
          local_220 = (long *)*puVar13;
        }
        local_218 = puVar13[1];
        *puVar13 = plVar14;
        puVar13[1] = 0;
        *(undefined1 *)(puVar13 + 2) = 0;
        puVar13 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_220,(ulong)this->viewName[sVar17]._M_dataplus._M_p);
        local_200 = &local_1f0;
        plVar14 = puVar13 + 2;
        if ((long *)*puVar13 == plVar14) {
          local_1f0 = *plVar14;
          lStack_1e8 = puVar13[3];
        }
        else {
          local_1f0 = *plVar14;
          local_200 = (long *)*puVar13;
        }
        local_1f8 = puVar13[1];
        *puVar13 = plVar14;
        puVar13[1] = 0;
        *(undefined1 *)(puVar13 + 2) = 0;
        puVar13 = (undefined8 *)std::__cxx11::string::append((char *)&local_200);
        local_1e0 = &local_1d0;
        plVar14 = puVar13 + 2;
        if ((long *)*puVar13 == plVar14) {
          local_1d0 = *plVar14;
          lStack_1c8 = puVar13[3];
        }
        else {
          local_1d0 = *plVar14;
          local_1e0 = (long *)*puVar13;
        }
        local_1d8 = puVar13[1];
        *puVar13 = plVar14;
        puVar13[1] = 0;
        *(undefined1 *)(puVar13 + 2) = 0;
        puVar13 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_1e0,(ulong)this->viewName[sVar17]._M_dataplus._M_p);
        local_1c0 = &local_1b0;
        plVar14 = puVar13 + 2;
        if ((long *)*puVar13 == plVar14) {
          local_1b0 = *plVar14;
          lStack_1a8 = puVar13[3];
        }
        else {
          local_1b0 = *plVar14;
          local_1c0 = (long *)*puVar13;
        }
        local_1b8 = puVar13[1];
        *puVar13 = plVar14;
        puVar13[1] = 0;
        *(undefined1 *)(puVar13 + 2) = 0;
        puVar13 = (undefined8 *)std::__cxx11::string::append((char *)&local_1c0);
        puVar18 = puVar13 + 2;
        if ((ulong *)*puVar13 == puVar18) {
          local_3f0 = *puVar18;
          lStack_3e8 = puVar13[3];
          local_400 = &local_3f0;
        }
        else {
          local_3f0 = *puVar18;
          local_400 = (ulong *)*puVar13;
        }
        local_3f8 = puVar13[1];
        *puVar13 = puVar18;
        puVar13[1] = 0;
        *(undefined1 *)(puVar13 + 2) = 0;
        puVar13 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_400,(ulong)local_5e0)
        ;
        puVar23 = puVar13 + 2;
        if ((undefined8 *)*puVar13 == puVar23) {
          local_3d0 = *puVar23;
          uStack_3c8 = puVar13[3];
          local_3e0 = &local_3d0;
        }
        else {
          local_3d0 = *puVar23;
          local_3e0 = (undefined8 *)*puVar13;
        }
        local_3d8 = puVar13[1];
        *puVar13 = puVar23;
        puVar13[1] = 0;
        *(undefined1 *)(puVar13 + 2) = 0;
        plVar14 = (long *)std::__cxx11::string::append((char *)&local_3e0);
        puVar18 = (ulong *)(plVar14 + 2);
        if ((ulong *)*plVar14 == puVar18) {
          local_3b0 = *puVar18;
          lStack_3a8 = plVar14[3];
          local_3c0 = &local_3b0;
        }
        else {
          local_3b0 = *puVar18;
          local_3c0 = (ulong *)*plVar14;
        }
        local_3b8 = plVar14[1];
        *plVar14 = (long)puVar18;
        plVar14[1] = 0;
        *(undefined1 *)(plVar14 + 2) = 0;
        cVar46 = (char)local_698;
        local_e8 = local_d8;
        std::__cxx11::string::_M_construct((ulong)&local_e8,((char)local_668 + cVar46) * '\x03');
        uVar39 = 0xf;
        if (local_3c0 != &local_3b0) {
          uVar39 = local_3b0;
        }
        if (uVar39 < (ulong)(local_e0 + local_3b8)) {
          uVar39 = 0xf;
          if (local_e8 != local_d8) {
            uVar39 = local_d8[0];
          }
          if (uVar39 < (ulong)(local_e0 + local_3b8)) goto LAB_00253743;
          puVar13 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_e8,0,(char *)0x0,(ulong)local_3c0);
        }
        else {
LAB_00253743:
          puVar13 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_3c0,(ulong)local_e8);
        }
        local_3a0 = &local_390;
        puVar23 = puVar13 + 2;
        if ((undefined8 *)*puVar13 == puVar23) {
          local_390 = *puVar23;
          uStack_388 = puVar13[3];
        }
        else {
          local_390 = *puVar23;
          local_3a0 = (undefined8 *)*puVar13;
        }
        local_398 = puVar13[1];
        *puVar13 = puVar23;
        puVar13[1] = 0;
        *(undefined1 *)puVar23 = 0;
        puVar13 = (undefined8 *)std::__cxx11::string::append((char *)&local_3a0);
        local_340 = &local_330;
        puVar18 = puVar13 + 2;
        if ((ulong *)*puVar13 == puVar18) {
          local_330 = *puVar18;
          lStack_328 = puVar13[3];
        }
        else {
          local_330 = *puVar18;
          local_340 = (ulong *)*puVar13;
        }
        local_338 = puVar13[1];
        *puVar13 = puVar18;
        puVar13[1] = 0;
        *(undefined1 *)(puVar13 + 2) = 0;
        local_108 = local_f8;
        std::__cxx11::string::_M_construct((ulong)&local_108,(cVar46 + (char)local_4d0) * '\x03');
        uVar39 = 0xf;
        if (local_340 != &local_330) {
          uVar39 = local_330;
        }
        if (uVar39 < (ulong)(local_100 + local_338)) {
          uVar39 = 0xf;
          if (local_108 != local_f8) {
            uVar39 = local_f8[0];
          }
          if (uVar39 < (ulong)(local_100 + local_338)) goto LAB_00253ce3;
          puVar13 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_108,0,(char *)0x0,(ulong)local_340);
        }
        else {
LAB_00253ce3:
          puVar13 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_340,(ulong)local_108);
        }
        local_380 = &local_370;
        puVar23 = puVar13 + 2;
        if ((undefined8 *)*puVar13 == puVar23) {
          local_370 = *puVar23;
          uStack_368 = puVar13[3];
        }
        else {
          local_370 = *puVar23;
          local_380 = (undefined8 *)*puVar13;
        }
        local_378 = puVar13[1];
        *puVar13 = puVar23;
        puVar13[1] = 0;
        *(undefined1 *)puVar23 = 0;
        puVar13 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_380,(ulong)this->viewName[sVar17]._M_dataplus._M_p);
        local_1a0 = &local_190;
        plVar14 = puVar13 + 2;
        if ((long *)*puVar13 == plVar14) {
          local_190 = *plVar14;
          lStack_188 = puVar13[3];
        }
        else {
          local_190 = *plVar14;
          local_1a0 = (long *)*puVar13;
        }
        local_198 = puVar13[1];
        *puVar13 = plVar14;
        puVar13[1] = 0;
        *(undefined1 *)(puVar13 + 2) = 0;
        puVar13 = (undefined8 *)std::__cxx11::string::append((char *)&local_1a0);
        local_180 = &local_170;
        plVar14 = puVar13 + 2;
        if ((long *)*puVar13 == plVar14) {
          local_170 = *plVar14;
          lStack_168 = puVar13[3];
        }
        else {
          local_170 = *plVar14;
          local_180 = (long *)*puVar13;
        }
        local_178 = puVar13[1];
        *puVar13 = plVar14;
        puVar13[1] = 0;
        *(undefined1 *)(puVar13 + 2) = 0;
        puVar13 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_180,(ulong)this->viewName[sVar17]._M_dataplus._M_p);
        local_320 = &local_310;
        puVar18 = puVar13 + 2;
        if ((ulong *)*puVar13 == puVar18) {
          local_310 = *puVar18;
          lStack_308 = puVar13[3];
        }
        else {
          local_310 = *puVar18;
          local_320 = (ulong *)*puVar13;
        }
        local_318 = puVar13[1];
        *puVar13 = puVar18;
        puVar13[1] = 0;
        *(undefined1 *)(puVar13 + 2) = 0;
        puVar13 = (undefined8 *)std::__cxx11::string::append((char *)&local_320);
        local_300 = &local_2f0;
        puVar23 = puVar13 + 2;
        if ((undefined8 *)*puVar13 == puVar23) {
          local_2f0 = *puVar23;
          uStack_2e8 = puVar13[3];
        }
        else {
          local_2f0 = *puVar23;
          local_300 = (undefined8 *)*puVar13;
        }
        local_2f8 = puVar13[1];
        *puVar13 = puVar23;
        puVar13[1] = 0;
        *(undefined1 *)(puVar13 + 2) = 0;
        puVar13 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_300,(ulong)this->viewName[sVar17]._M_dataplus._M_p);
        local_2c0 = &local_2b0;
        puVar18 = puVar13 + 2;
        if ((ulong *)*puVar13 == puVar18) {
          local_2b0 = *puVar18;
          lStack_2a8 = puVar13[3];
        }
        else {
          local_2b0 = *puVar18;
          local_2c0 = (ulong *)*puVar13;
        }
        local_2b8 = puVar13[1];
        *puVar13 = puVar18;
        puVar13[1] = 0;
        *(undefined1 *)(puVar13 + 2) = 0;
        puVar13 = (undefined8 *)std::__cxx11::string::append((char *)&local_2c0);
        local_2e0 = &local_2d0;
        puVar23 = puVar13 + 2;
        if ((undefined8 *)*puVar13 == puVar23) {
          local_2d0 = *puVar23;
          uStack_2c8 = puVar13[3];
        }
        else {
          local_2d0 = *puVar23;
          local_2e0 = (undefined8 *)*puVar13;
        }
        local_2d8 = puVar13[1];
        *puVar13 = puVar23;
        puVar13[1] = 0;
        *(undefined1 *)(puVar13 + 2) = 0;
        plVar14 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&local_2e0,
                                     (ulong)this->viewName[sVar17]._M_dataplus._M_p);
        local_610 = &local_600;
        puVar18 = (ulong *)(plVar14 + 2);
        if ((ulong *)*plVar14 == puVar18) {
          local_600 = *puVar18;
          lStack_5f8 = plVar14[3];
        }
        else {
          local_600 = *puVar18;
          local_610 = (ulong *)*plVar14;
        }
        local_608 = plVar14[1];
        *plVar14 = (long)puVar18;
        plVar14[1] = 0;
        *(undefined1 *)(plVar14 + 2) = 0;
        plVar14 = (long *)std::__cxx11::string::append((char *)&local_610);
        local_5b8 = &local_5a8;
        puVar18 = (ulong *)(plVar14 + 2);
        if ((ulong *)*plVar14 == puVar18) {
          local_5a8 = *puVar18;
          lStack_5a0 = plVar14[3];
        }
        else {
          local_5a8 = *puVar18;
          local_5b8 = (ulong *)*plVar14;
        }
        local_5b0 = plVar14[1];
        *plVar14 = (long)puVar18;
        plVar14[1] = 0;
        *(undefined1 *)(plVar14 + 2) = 0;
        local_128 = local_118;
        std::__cxx11::string::_M_construct
                  ((ulong)&local_128,((char)local_698 + (char)local_4d0) * '\x03');
        uVar39 = 0xf;
        if (local_5b8 != &local_5a8) {
          uVar39 = local_5a8;
        }
        if (uVar39 < (ulong)(local_120 + local_5b0)) {
          uVar39 = 0xf;
          if (local_128 != local_118) {
            uVar39 = local_118[0];
          }
          if (uVar39 < (ulong)(local_120 + local_5b0)) goto LAB_00254304;
          puVar13 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_128,0,(char *)0x0,(ulong)local_5b8);
        }
        else {
LAB_00254304:
          puVar13 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_5b8,(ulong)local_128);
        }
        local_690 = &local_680;
        puVar18 = puVar13 + 2;
        if ((ulong *)*puVar13 == puVar18) {
          local_680 = *puVar18;
          lStack_678 = puVar13[3];
        }
        else {
          local_680 = *puVar18;
          local_690 = (ulong *)*puVar13;
        }
        local_688 = puVar13[1];
        *puVar13 = puVar18;
        puVar13[1] = 0;
        *(undefined1 *)puVar18 = 0;
        plVar14 = (long *)std::__cxx11::string::append((char *)&local_690);
        local_640._M_w = (_WordT)&local_630;
        puVar18 = (ulong *)(plVar14 + 2);
        if ((ulong *)*plVar14 == puVar18) {
          local_630 = *puVar18;
          lStack_628 = plVar14[3];
        }
        else {
          local_630 = *puVar18;
          local_640._M_w = (_WordT)*plVar14;
        }
        local_638 = plVar14[1];
        *plVar14 = (long)puVar18;
        plVar14[1] = 0;
        *(undefined1 *)(plVar14 + 2) = 0;
        plVar14 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&local_640,
                                     (ulong)this->viewName[sVar17]._M_dataplus._M_p);
        local_6d8._M_dataplus._M_p = (pointer)&local_6d8.field_2;
        psVar24 = (size_type *)(plVar14 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar14 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar24) {
          local_6d8.field_2._M_allocated_capacity = *psVar24;
          local_6d8.field_2._8_8_ = plVar14[3];
        }
        else {
          local_6d8.field_2._M_allocated_capacity = *psVar24;
          local_6d8._M_dataplus._M_p = (pointer)*plVar14;
        }
        local_6d8._M_string_length = plVar14[1];
        *plVar14 = (long)psVar24;
        plVar14[1] = 0;
        *(undefined1 *)(plVar14 + 2) = 0;
        plVar14 = (long *)std::__cxx11::string::append((char *)&local_6d8);
        local_6f8._M_dataplus._M_p = (pointer)&local_6f8.field_2;
        psVar24 = (size_type *)(plVar14 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar14 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar24) {
          local_6f8.field_2._M_allocated_capacity = *psVar24;
          local_6f8.field_2._8_8_ = plVar14[3];
        }
        else {
          local_6f8.field_2._M_allocated_capacity = *psVar24;
          local_6f8._M_dataplus._M_p = (pointer)*plVar14;
        }
        local_6f8._M_string_length = plVar14[1];
        *plVar14 = (long)psVar24;
        plVar14[1] = 0;
        *(undefined1 *)(plVar14 + 2) = 0;
        plVar14 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&local_6f8,
                                     (ulong)this->viewName[sVar17]._M_dataplus._M_p);
        local_598._0_8_ = &local_588;
        paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar14 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar14 == paVar25) {
          local_588 = *paVar25;
        }
        else {
          local_588._M_allocated_capacity = paVar25->_M_allocated_capacity;
          local_598._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*plVar14;
        }
        local_598._8_8_ = plVar14[1];
        *plVar14 = (long)paVar25;
        plVar14[1] = 0;
        *(undefined1 *)(plVar14 + 2) = 0;
        plVar14 = (long *)std::__cxx11::string::append(local_598);
        local_4c8._0_8_ = local_4c8 + 0x10;
        p_Var32 = (_WordT *)(plVar14 + 2);
        if ((_WordT *)*plVar14 == p_Var32) {
          local_4c8._16_8_ = *p_Var32;
          local_4c8._24_8_ = plVar14[3];
        }
        else {
          local_4c8._16_8_ = *p_Var32;
          local_4c8._0_8_ = (_WordT *)*plVar14;
        }
        local_4c8._8_8_ = plVar14[1];
        *plVar14 = (long)p_Var32;
        plVar14[1] = 0;
        *(undefined1 *)(plVar14 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_6b8,local_4c8._0_8_);
        if ((undefined1 *)local_4c8._0_8_ != local_4c8 + 0x10) {
          operator_delete((void *)local_4c8._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_598._0_8_ != &local_588) {
          operator_delete((void *)local_598._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_6f8._M_dataplus._M_p != &local_6f8.field_2) {
          operator_delete(local_6f8._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_6d8._M_dataplus._M_p != &local_6d8.field_2) {
          operator_delete(local_6d8._M_dataplus._M_p);
        }
        if ((ulong *)local_640._M_w != &local_630) {
          operator_delete((void *)local_640._M_w);
        }
        if (local_690 != &local_680) {
          operator_delete(local_690);
        }
        if (local_128 != local_118) {
          operator_delete(local_128);
        }
        if (local_5b8 != &local_5a8) {
          operator_delete(local_5b8);
        }
        if (local_610 != &local_600) {
          operator_delete(local_610);
        }
        if (local_2e0 != &local_2d0) {
          operator_delete(local_2e0);
        }
        if (local_2c0 != &local_2b0) {
          operator_delete(local_2c0);
        }
        if (local_300 != &local_2f0) {
          operator_delete(local_300);
        }
        if (local_320 != &local_310) {
          operator_delete(local_320);
        }
        if (local_180 != &local_170) {
          operator_delete(local_180);
        }
        if (local_1a0 != &local_190) {
          operator_delete(local_1a0);
        }
        if (local_380 != &local_370) {
          operator_delete(local_380);
        }
        if (local_108 != local_f8) {
          operator_delete(local_108);
        }
        if (local_340 != &local_330) {
          operator_delete(local_340);
        }
        if (local_3a0 != &local_390) {
          operator_delete(local_3a0);
        }
        if (local_e8 != local_d8) {
          operator_delete(local_e8);
        }
        if (local_3c0 != &local_3b0) {
          operator_delete(local_3c0);
        }
        if (local_3e0 != &local_3d0) {
          operator_delete(local_3e0);
        }
        if (local_400 != &local_3f0) {
          operator_delete(local_400);
        }
        if (local_1c0 != &local_1b0) {
          operator_delete(local_1c0);
        }
        if (local_1e0 != &local_1d0) {
          operator_delete(local_1e0);
        }
        if (local_200 != &local_1f0) {
          operator_delete(local_200);
        }
        if (local_220 != &local_210) {
          operator_delete(local_220);
        }
        if (local_360 != &local_350) {
          operator_delete(local_360);
        }
        if (local_c8 != local_b8) {
          operator_delete(local_c8);
        }
        if (local_240 != &local_230) {
          operator_delete(local_240);
        }
        if (local_160 != &local_150) {
          operator_delete(local_160);
        }
        if (local_260 != &local_250) {
          operator_delete(local_260);
        }
        if (local_280 != &local_270) {
          operator_delete(local_280);
        }
        if (local_2a0 != &local_290) {
          operator_delete(local_2a0);
        }
        if (local_80 != &local_70) {
          operator_delete(local_80);
        }
        if (local_a0 != &local_90) {
          operator_delete(local_a0);
        }
        if (local_50[0] != local_40) {
          operator_delete(local_50[0]);
        }
        cVar46 = (char)local_698;
        local_5b8 = &local_5a8;
        std::__cxx11::string::_M_construct((ulong)&local_5b8,((char)local_4d0 + cVar46) * '\x03');
        puVar13 = (undefined8 *)std::__cxx11::string::append((char *)&local_5b8);
        local_690 = &local_680;
        puVar18 = puVar13 + 2;
        if ((ulong *)*puVar13 == puVar18) {
          local_680 = *puVar18;
          lStack_678 = puVar13[3];
        }
        else {
          local_680 = *puVar18;
          local_690 = (ulong *)*puVar13;
        }
        local_688 = puVar13[1];
        *puVar13 = puVar18;
        puVar13[1] = 0;
        *(undefined1 *)(puVar13 + 2) = 0;
        puVar13 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_690,(ulong)this->viewName[sVar17]._M_dataplus._M_p);
        local_640._M_w = (_WordT)&local_630;
        puVar18 = puVar13 + 2;
        if ((ulong *)*puVar13 == puVar18) {
          local_630 = *puVar18;
          lStack_628 = puVar13[3];
        }
        else {
          local_630 = *puVar18;
          local_640._M_w = (_WordT)*puVar13;
        }
        local_638 = puVar13[1];
        *puVar13 = puVar18;
        puVar13[1] = 0;
        *(undefined1 *)(puVar13 + 2) = 0;
        puVar13 = (undefined8 *)std::__cxx11::string::append((char *)&local_640);
        local_6d8._M_dataplus._M_p = (pointer)&local_6d8.field_2;
        puVar18 = puVar13 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar13 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar18) {
          local_6d8.field_2._M_allocated_capacity = *puVar18;
          local_6d8.field_2._8_8_ = puVar13[3];
        }
        else {
          local_6d8.field_2._M_allocated_capacity = *puVar18;
          local_6d8._M_dataplus._M_p = (pointer)*puVar13;
        }
        local_6d8._M_string_length = puVar13[1];
        *puVar13 = puVar18;
        puVar13[1] = 0;
        *(undefined1 *)(puVar13 + 2) = 0;
        local_610 = &local_600;
        std::__cxx11::string::_M_construct((ulong)&local_610,(cVar46 + (char)local_668) * '\x03');
        uVar31 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_6d8._M_dataplus._M_p != &local_6d8.field_2) {
          uVar31 = local_6d8.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar31 < local_608 + local_6d8._M_string_length) {
          uVar39 = 0xf;
          if (local_610 != &local_600) {
            uVar39 = local_600;
          }
          if (uVar39 < local_608 + local_6d8._M_string_length) goto LAB_002553fb;
          puVar13 = (undefined8 *)
                    std::__cxx11::string::replace
                              ((ulong)&local_610,0,(char *)0x0,(ulong)local_6d8._M_dataplus._M_p);
        }
        else {
LAB_002553fb:
          puVar13 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_6d8,(ulong)local_610);
        }
        puVar18 = puVar13 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar13 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar18) {
          local_6f8.field_2._M_allocated_capacity = *puVar18;
          local_6f8.field_2._8_8_ = puVar13[3];
          local_6f8._M_dataplus._M_p = (pointer)&local_6f8.field_2;
        }
        else {
          local_6f8.field_2._M_allocated_capacity = *puVar18;
          local_6f8._M_dataplus._M_p = (pointer)*puVar13;
        }
        local_6f8._M_string_length = puVar13[1];
        *puVar13 = puVar18;
        puVar13[1] = 0;
        *(undefined1 *)puVar18 = 0;
        plVar14 = (long *)std::__cxx11::string::append((char *)&local_6f8);
        local_598._0_8_ = &local_588;
        paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar14 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar14 == paVar25) {
          local_588 = *paVar25;
        }
        else {
          local_588._M_allocated_capacity = paVar25->_M_allocated_capacity;
          local_598._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*plVar14;
        }
        local_598._8_8_ = plVar14[1];
        *plVar14 = (long)paVar25;
        plVar14[1] = 0;
        *(undefined1 *)(plVar14 + 2) = 0;
        puVar13 = (undefined8 *)
                  std::__cxx11::string::_M_append(local_598,(ulong)local_660._M_dataplus._M_p);
        local_4c8._0_8_ = local_4c8 + 0x10;
        p_Var32 = puVar13 + 2;
        if ((_WordT *)*puVar13 == p_Var32) {
          local_4c8._16_8_ = *p_Var32;
          local_4c8._24_8_ = puVar13[3];
        }
        else {
          local_4c8._16_8_ = *p_Var32;
          local_4c8._0_8_ = (_WordT *)*puVar13;
        }
        local_4c8._8_8_ = puVar13[1];
        *puVar13 = p_Var32;
        puVar13[1] = 0;
        *(undefined1 *)(puVar13 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_660,local_4c8._0_8_);
        if ((undefined1 *)local_4c8._0_8_ != local_4c8 + 0x10) {
          operator_delete((void *)local_4c8._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_598._0_8_ != &local_588) {
          operator_delete((void *)local_598._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_6f8._M_dataplus._M_p != &local_6f8.field_2) {
LAB_0025559a:
          operator_delete(local_6f8._M_dataplus._M_p);
        }
      }
      else {
        local_160 = &local_150;
        std::__cxx11::string::_M_construct
                  ((ulong)&local_160,((char)local_698 + (char)local_668) * '\x03');
        plVar14 = (long *)std::__cxx11::string::append((char *)&local_160);
        paVar25 = &local_6f8.field_2;
        puVar18 = (ulong *)(plVar14 + 2);
        if ((ulong *)*plVar14 == puVar18) {
          local_230 = *puVar18;
          lStack_228 = plVar14[3];
          local_240 = &local_230;
        }
        else {
          local_230 = *puVar18;
          local_240 = (ulong *)*plVar14;
        }
        local_238 = plVar14[1];
        *plVar14 = (long)puVar18;
        plVar14[1] = 0;
        *(undefined1 *)(plVar14 + 2) = 0;
        puVar13 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_240,(ulong)(node_00->_name)._M_dataplus._M_p);
        puVar23 = puVar13 + 2;
        if ((undefined8 *)*puVar13 == puVar23) {
          local_350 = *puVar23;
          uStack_348 = puVar13[3];
          local_360 = &local_350;
        }
        else {
          local_350 = *puVar23;
          local_360 = (undefined8 *)*puVar13;
        }
        local_358 = puVar13[1];
        *puVar13 = puVar23;
        puVar13[1] = 0;
        *(undefined1 *)(puVar13 + 2) = 0;
        plVar14 = (long *)std::__cxx11::string::append((char *)&local_360);
        local_220 = &local_210;
        plVar22 = plVar14 + 2;
        if ((long *)*plVar14 == plVar22) {
          local_210 = *plVar22;
          lStack_208 = plVar14[3];
        }
        else {
          local_210 = *plVar22;
          local_220 = (long *)*plVar14;
        }
        local_218 = plVar14[1];
        *plVar14 = (long)plVar22;
        plVar14[1] = 0;
        *(undefined1 *)(plVar14 + 2) = 0;
        plVar14 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&local_220,(ulong)(node_00->_name)._M_dataplus._M_p);
        local_200 = &local_1f0;
        plVar22 = plVar14 + 2;
        if ((long *)*plVar14 == plVar22) {
          local_1f0 = *plVar22;
          lStack_1e8 = plVar14[3];
        }
        else {
          local_1f0 = *plVar22;
          local_200 = (long *)*plVar14;
        }
        local_1f8 = plVar14[1];
        *plVar14 = (long)plVar22;
        plVar14[1] = 0;
        *(undefined1 *)(plVar14 + 2) = 0;
        plVar14 = (long *)std::__cxx11::string::append((char *)&local_200);
        local_1e0 = &local_1d0;
        plVar22 = plVar14 + 2;
        if ((long *)*plVar14 == plVar22) {
          local_1d0 = *plVar22;
          lStack_1c8 = plVar14[3];
        }
        else {
          local_1d0 = *plVar22;
          local_1e0 = (long *)*plVar14;
        }
        local_1d8 = plVar14[1];
        *plVar14 = (long)plVar22;
        plVar14[1] = 0;
        *(undefined1 *)(plVar14 + 2) = 0;
        plVar14 = (long *)std::__cxx11::string::_M_append((char *)&local_1e0,(ulong)local_5e0);
        local_1c0 = &local_1b0;
        plVar22 = plVar14 + 2;
        if ((long *)*plVar14 == plVar22) {
          local_1b0 = *plVar22;
          lStack_1a8 = plVar14[3];
        }
        else {
          local_1b0 = *plVar22;
          local_1c0 = (long *)*plVar14;
        }
        local_1b8 = plVar14[1];
        *plVar14 = (long)plVar22;
        plVar14[1] = 0;
        *(undefined1 *)(plVar14 + 2) = 0;
        plVar14 = (long *)std::__cxx11::string::append((char *)&local_1c0);
        local_400 = &local_3f0;
        puVar18 = (ulong *)(plVar14 + 2);
        if ((ulong *)*plVar14 == puVar18) {
          local_3f0 = *puVar18;
          lStack_3e8 = plVar14[3];
        }
        else {
          local_3f0 = *puVar18;
          local_400 = (ulong *)*plVar14;
        }
        local_3f8 = plVar14[1];
        *plVar14 = (long)puVar18;
        plVar14[1] = 0;
        *(undefined1 *)(plVar14 + 2) = 0;
        local_260 = &local_250;
        std::__cxx11::string::_M_construct
                  ((ulong)&local_260,((char)local_698 + (char)local_668) * '\x03');
        uVar39 = 0xf;
        if (local_400 != &local_3f0) {
          uVar39 = local_3f0;
        }
        if (uVar39 < (ulong)(local_258 + local_3f8)) {
          uVar39 = 0xf;
          if (local_260 != &local_250) {
            uVar39 = local_250;
          }
          if (uVar39 < (ulong)(local_258 + local_3f8)) goto LAB_00253323;
          puVar13 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_260,0,(char *)0x0,(ulong)local_400);
        }
        else {
LAB_00253323:
          puVar13 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_400,(ulong)local_260);
        }
        local_3e0 = &local_3d0;
        puVar23 = puVar13 + 2;
        if ((undefined8 *)*puVar13 == puVar23) {
          local_3d0 = *puVar23;
          uStack_3c8 = puVar13[3];
        }
        else {
          local_3d0 = *puVar23;
          local_3e0 = (undefined8 *)*puVar13;
        }
        local_3d8 = puVar13[1];
        *puVar13 = puVar23;
        puVar13[1] = 0;
        *(undefined1 *)puVar23 = 0;
        puVar13 = (undefined8 *)std::__cxx11::string::append((char *)&local_3e0);
        puVar18 = puVar13 + 2;
        if ((ulong *)*puVar13 == puVar18) {
          local_3b0 = *puVar18;
          lStack_3a8 = puVar13[3];
          local_3c0 = &local_3b0;
        }
        else {
          local_3b0 = *puVar18;
          local_3c0 = (ulong *)*puVar13;
        }
        local_3b8 = puVar13[1];
        *puVar13 = puVar18;
        puVar13[1] = 0;
        *(undefined1 *)(puVar13 + 2) = 0;
        puVar13 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_3c0,(ulong)(node_00->_name)._M_dataplus._M_p);
        puVar23 = puVar13 + 2;
        if ((undefined8 *)*puVar13 == puVar23) {
          local_390 = *puVar23;
          uStack_388 = puVar13[3];
          local_3a0 = &local_390;
        }
        else {
          local_390 = *puVar23;
          local_3a0 = (undefined8 *)*puVar13;
        }
        local_398 = puVar13[1];
        *puVar13 = puVar23;
        puVar13[1] = 0;
        *(undefined1 *)(puVar13 + 2) = 0;
        plVar14 = (long *)std::__cxx11::string::append((char *)&local_3a0);
        puVar18 = (ulong *)(plVar14 + 2);
        if ((ulong *)*plVar14 == puVar18) {
          local_330 = *puVar18;
          lStack_328 = plVar14[3];
          local_340 = &local_330;
        }
        else {
          local_330 = *puVar18;
          local_340 = (ulong *)*plVar14;
        }
        local_338 = plVar14[1];
        *plVar14 = (long)puVar18;
        plVar14[1] = 0;
        *(undefined1 *)(plVar14 + 2) = 0;
        puVar13 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_340,(ulong)(node_00->_name)._M_dataplus._M_p);
        puVar23 = puVar13 + 2;
        if ((undefined8 *)*puVar13 == puVar23) {
          local_370 = *puVar23;
          uStack_368 = puVar13[3];
          local_380 = &local_370;
        }
        else {
          local_370 = *puVar23;
          local_380 = (undefined8 *)*puVar13;
        }
        local_378 = puVar13[1];
        *puVar13 = puVar23;
        puVar13[1] = 0;
        *(undefined1 *)(puVar13 + 2) = 0;
        plVar14 = (long *)std::__cxx11::string::append((char *)&local_380);
        local_1a0 = &local_190;
        plVar22 = plVar14 + 2;
        if ((long *)*plVar14 == plVar22) {
          local_190 = *plVar22;
          lStack_188 = plVar14[3];
        }
        else {
          local_190 = *plVar22;
          local_1a0 = (long *)*plVar14;
        }
        local_198 = plVar14[1];
        *plVar14 = (long)plVar22;
        plVar14[1] = 0;
        *(undefined1 *)(plVar14 + 2) = 0;
        plVar14 = (long *)std::__cxx11::string::_M_append((char *)&local_1a0,(ulong)local_5e0);
        local_180 = &local_170;
        plVar22 = plVar14 + 2;
        if ((long *)*plVar14 == plVar22) {
          local_170 = *plVar22;
          lStack_168 = plVar14[3];
        }
        else {
          local_170 = *plVar22;
          local_180 = (long *)*plVar14;
        }
        local_178 = plVar14[1];
        *plVar14 = (long)plVar22;
        plVar14[1] = 0;
        *(undefined1 *)(plVar14 + 2) = 0;
        plVar14 = (long *)std::__cxx11::string::append((char *)&local_180);
        puVar18 = (ulong *)(plVar14 + 2);
        if ((ulong *)*plVar14 == puVar18) {
          local_310 = *puVar18;
          lStack_308 = plVar14[3];
          local_320 = &local_310;
        }
        else {
          local_310 = *puVar18;
          local_320 = (ulong *)*plVar14;
        }
        local_318 = plVar14[1];
        *plVar14 = (long)puVar18;
        plVar14[1] = 0;
        *(undefined1 *)(plVar14 + 2) = 0;
        cVar46 = (char)local_698;
        local_280 = &local_270;
        std::__cxx11::string::_M_construct((ulong)&local_280,((char)local_668 + cVar46) * '\x03');
        uVar39 = 0xf;
        if (local_320 != &local_310) {
          uVar39 = local_310;
        }
        if (uVar39 < (ulong)(local_278 + local_318)) {
          uVar39 = 0xf;
          if (local_280 != &local_270) {
            uVar39 = local_270;
          }
          if (uVar39 < (ulong)(local_278 + local_318)) goto LAB_00253b5b;
          puVar13 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_280,0,(char *)0x0,(ulong)local_320);
        }
        else {
LAB_00253b5b:
          puVar13 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_320,(ulong)local_280);
        }
        local_300 = &local_2f0;
        puVar23 = puVar13 + 2;
        if ((undefined8 *)*puVar13 == puVar23) {
          local_2f0 = *puVar23;
          uStack_2e8 = puVar13[3];
        }
        else {
          local_2f0 = *puVar23;
          local_300 = (undefined8 *)*puVar13;
        }
        local_2f8 = puVar13[1];
        *puVar13 = puVar23;
        puVar13[1] = 0;
        *(undefined1 *)puVar23 = 0;
        plVar14 = (long *)std::__cxx11::string::append((char *)&local_300);
        local_2c0 = &local_2b0;
        puVar18 = (ulong *)(plVar14 + 2);
        if ((ulong *)*plVar14 == puVar18) {
          local_2b0 = *puVar18;
          lStack_2a8 = plVar14[3];
        }
        else {
          local_2b0 = *puVar18;
          local_2c0 = (ulong *)*plVar14;
        }
        local_2b8 = plVar14[1];
        *plVar14 = (long)puVar18;
        plVar14[1] = 0;
        *(undefined1 *)(plVar14 + 2) = 0;
        local_2a0 = &local_290;
        std::__cxx11::string::_M_construct((ulong)&local_2a0,(cVar46 + (char)local_4d0) * '\x03');
        uVar39 = 0xf;
        if (local_2c0 != &local_2b0) {
          uVar39 = local_2b0;
        }
        if (uVar39 < (ulong)(local_298 + local_2b8)) {
          uVar39 = 0xf;
          if (local_2a0 != &local_290) {
            uVar39 = local_290;
          }
          if (uVar39 < (ulong)(local_298 + local_2b8)) goto LAB_00253e6b;
          puVar13 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_2a0,0,(char *)0x0,(ulong)local_2c0);
        }
        else {
LAB_00253e6b:
          puVar13 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_2c0,(ulong)local_2a0);
        }
        local_2e0 = &local_2d0;
        puVar23 = puVar13 + 2;
        if ((undefined8 *)*puVar13 == puVar23) {
          local_2d0 = *puVar23;
          uStack_2c8 = puVar13[3];
        }
        else {
          local_2d0 = *puVar23;
          local_2e0 = (undefined8 *)*puVar13;
        }
        local_2d8 = puVar13[1];
        *puVar13 = puVar23;
        puVar13[1] = 0;
        *(undefined1 *)puVar23 = 0;
        puVar13 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_2e0,(ulong)(node_00->_name)._M_dataplus._M_p);
        local_610 = &local_600;
        puVar18 = puVar13 + 2;
        if ((ulong *)*puVar13 == puVar18) {
          local_600 = *puVar18;
          lStack_5f8 = puVar13[3];
        }
        else {
          local_600 = *puVar18;
          local_610 = (ulong *)*puVar13;
        }
        local_608 = puVar13[1];
        *puVar13 = puVar18;
        puVar13[1] = 0;
        *(undefined1 *)(puVar13 + 2) = 0;
        puVar13 = (undefined8 *)std::__cxx11::string::append((char *)&local_610);
        puVar18 = puVar13 + 2;
        if ((ulong *)*puVar13 == puVar18) {
          local_5a8 = *puVar18;
          lStack_5a0 = puVar13[3];
          local_5b8 = &local_5a8;
        }
        else {
          local_5a8 = *puVar18;
          local_5b8 = (ulong *)*puVar13;
        }
        local_5b0 = puVar13[1];
        *puVar13 = puVar18;
        puVar13[1] = 0;
        *(undefined1 *)(puVar13 + 2) = 0;
        plVar14 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&local_5b8,(ulong)(node_00->_name)._M_dataplus._M_p);
        local_690 = &local_680;
        puVar18 = (ulong *)(plVar14 + 2);
        if ((ulong *)*plVar14 == puVar18) {
          local_680 = *puVar18;
          lStack_678 = plVar14[3];
        }
        else {
          local_680 = *puVar18;
          local_690 = (ulong *)*plVar14;
        }
        local_688 = plVar14[1];
        *plVar14 = (long)puVar18;
        plVar14[1] = 0;
        *(undefined1 *)(plVar14 + 2) = 0;
        plVar14 = (long *)std::__cxx11::string::append((char *)&local_690);
        local_640._M_w = (_WordT)&local_630;
        puVar18 = (ulong *)(plVar14 + 2);
        if ((ulong *)*plVar14 == puVar18) {
          local_630 = *puVar18;
          lStack_628 = plVar14[3];
        }
        else {
          local_630 = *puVar18;
          local_640._M_w = (_WordT)*plVar14;
        }
        local_638 = plVar14[1];
        *plVar14 = (long)puVar18;
        plVar14[1] = 0;
        *(undefined1 *)(plVar14 + 2) = 0;
        plVar14 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&local_640,(ulong)(node_00->_name)._M_dataplus._M_p);
        local_6d8._M_dataplus._M_p = (pointer)&local_6d8.field_2;
        psVar24 = (size_type *)(plVar14 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar14 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar24) {
          local_6d8.field_2._M_allocated_capacity = *psVar24;
          local_6d8.field_2._8_8_ = plVar14[3];
        }
        else {
          local_6d8.field_2._M_allocated_capacity = *psVar24;
          local_6d8._M_dataplus._M_p = (pointer)*plVar14;
        }
        local_6d8._M_string_length = plVar14[1];
        *plVar14 = (long)psVar24;
        plVar14[1] = 0;
        *(undefined1 *)(plVar14 + 2) = 0;
        plVar14 = (long *)std::__cxx11::string::append((char *)&local_6d8);
        psVar24 = (size_type *)(plVar14 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar14 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar24) {
          local_6f8.field_2._M_allocated_capacity = *psVar24;
          local_6f8.field_2._8_8_ = plVar14[3];
          local_6f8._M_dataplus._M_p = (pointer)paVar25;
        }
        else {
          local_6f8.field_2._M_allocated_capacity = *psVar24;
          local_6f8._M_dataplus._M_p = (pointer)*plVar14;
        }
        local_6f8._M_string_length = plVar14[1];
        *plVar14 = (long)psVar24;
        plVar14[1] = 0;
        *(undefined1 *)(plVar14 + 2) = 0;
        plVar14 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&local_6f8,(ulong)(node_00->_name)._M_dataplus._M_p);
        local_598._0_8_ = &local_588;
        paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar14 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar14 == paVar20) {
          local_588 = *paVar20;
        }
        else {
          local_588._M_allocated_capacity = paVar20->_M_allocated_capacity;
          local_598._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*plVar14;
        }
        local_598._8_8_ = plVar14[1];
        *plVar14 = (long)paVar20;
        plVar14[1] = 0;
        *(undefined1 *)(plVar14 + 2) = 0;
        plVar14 = (long *)std::__cxx11::string::append(local_598);
        local_4c8._0_8_ = local_4c8 + 0x10;
        p_Var32 = (_WordT *)(plVar14 + 2);
        if ((_WordT *)*plVar14 == p_Var32) {
          local_4c8._16_8_ = *p_Var32;
          local_4c8._24_8_ = plVar14[3];
        }
        else {
          local_4c8._16_8_ = *p_Var32;
          local_4c8._0_8_ = (_WordT *)*plVar14;
        }
        local_4c8._8_8_ = plVar14[1];
        *plVar14 = (long)p_Var32;
        plVar14[1] = 0;
        *(undefined1 *)(plVar14 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_6b8,local_4c8._0_8_);
        if ((undefined1 *)local_4c8._0_8_ != local_4c8 + 0x10) {
          operator_delete((void *)local_4c8._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_598._0_8_ != &local_588) {
          operator_delete((void *)local_598._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_6f8._M_dataplus._M_p != paVar25) {
          operator_delete(local_6f8._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_6d8._M_dataplus._M_p != &local_6d8.field_2) {
          operator_delete(local_6d8._M_dataplus._M_p);
        }
        if ((ulong *)local_640._M_w != &local_630) {
          operator_delete((void *)local_640._M_w);
        }
        if (local_690 != &local_680) {
          operator_delete(local_690);
        }
        if (local_5b8 != &local_5a8) {
          operator_delete(local_5b8);
        }
        if (local_610 != &local_600) {
          operator_delete(local_610);
        }
        if (local_2e0 != &local_2d0) {
          operator_delete(local_2e0);
        }
        if (local_2a0 != &local_290) {
          operator_delete(local_2a0);
        }
        if (local_2c0 != &local_2b0) {
          operator_delete(local_2c0);
        }
        if (local_300 != &local_2f0) {
          operator_delete(local_300);
        }
        if (local_280 != &local_270) {
          operator_delete(local_280);
        }
        if (local_320 != &local_310) {
          operator_delete(local_320);
        }
        if (local_180 != &local_170) {
          operator_delete(local_180);
        }
        if (local_1a0 != &local_190) {
          operator_delete(local_1a0);
        }
        if (local_380 != &local_370) {
          operator_delete(local_380);
        }
        if (local_340 != &local_330) {
          operator_delete(local_340);
        }
        if (local_3a0 != &local_390) {
          operator_delete(local_3a0);
        }
        if (local_3c0 != &local_3b0) {
          operator_delete(local_3c0);
        }
        if (local_3e0 != &local_3d0) {
          operator_delete(local_3e0);
        }
        if (local_260 != &local_250) {
          operator_delete(local_260);
        }
        if (local_400 != &local_3f0) {
          operator_delete(local_400);
        }
        if (local_1c0 != &local_1b0) {
          operator_delete(local_1c0);
        }
        if (local_1e0 != &local_1d0) {
          operator_delete(local_1e0);
        }
        if (local_200 != &local_1f0) {
          operator_delete(local_200);
        }
        if (local_220 != &local_210) {
          operator_delete(local_220);
        }
        if (local_360 != &local_350) {
          operator_delete(local_360);
        }
        if (local_240 != &local_230) {
          operator_delete(local_240);
        }
        if (local_160 != &local_150) {
          operator_delete(local_160);
        }
        cVar46 = (char)local_698;
        local_5b8 = &local_5a8;
        std::__cxx11::string::_M_construct((ulong)&local_5b8,((char)local_4d0 + cVar46) * '\x03');
        plVar14 = (long *)std::__cxx11::string::append((char *)&local_5b8);
        local_690 = &local_680;
        puVar18 = (ulong *)(plVar14 + 2);
        if ((ulong *)*plVar14 == puVar18) {
          local_680 = *puVar18;
          lStack_678 = plVar14[3];
        }
        else {
          local_680 = *puVar18;
          local_690 = (ulong *)*plVar14;
        }
        local_688 = plVar14[1];
        *plVar14 = (long)puVar18;
        plVar14[1] = 0;
        *(undefined1 *)(plVar14 + 2) = 0;
        plVar14 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&local_690,(ulong)(node_00->_name)._M_dataplus._M_p);
        local_640._M_w = (_WordT)&local_630;
        puVar18 = (ulong *)(plVar14 + 2);
        if ((ulong *)*plVar14 == puVar18) {
          local_630 = *puVar18;
          lStack_628 = plVar14[3];
        }
        else {
          local_630 = *puVar18;
          local_640._M_w = (_WordT)*plVar14;
        }
        local_638 = plVar14[1];
        *plVar14 = (long)puVar18;
        plVar14[1] = 0;
        *(undefined1 *)(plVar14 + 2) = 0;
        puVar13 = (undefined8 *)std::__cxx11::string::append((char *)&local_640);
        local_6d8._M_dataplus._M_p = (pointer)&local_6d8.field_2;
        puVar18 = puVar13 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar13 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar18) {
          local_6d8.field_2._M_allocated_capacity = *puVar18;
          local_6d8.field_2._8_8_ = puVar13[3];
        }
        else {
          local_6d8.field_2._M_allocated_capacity = *puVar18;
          local_6d8._M_dataplus._M_p = (pointer)*puVar13;
        }
        local_6d8._M_string_length = puVar13[1];
        *puVar13 = puVar18;
        puVar13[1] = 0;
        *(undefined1 *)(puVar13 + 2) = 0;
        local_610 = &local_600;
        std::__cxx11::string::_M_construct((ulong)&local_610,(cVar46 + (char)local_668) * '\x03');
        uVar31 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_6d8._M_dataplus._M_p != &local_6d8.field_2) {
          uVar31 = local_6d8.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar31 < local_608 + local_6d8._M_string_length) {
          uVar39 = 0xf;
          if (local_610 != &local_600) {
            uVar39 = local_600;
          }
          if (uVar39 < local_608 + local_6d8._M_string_length) goto LAB_00254b9f;
          puVar13 = (undefined8 *)
                    std::__cxx11::string::replace
                              ((ulong)&local_610,0,(char *)0x0,(ulong)local_6d8._M_dataplus._M_p);
        }
        else {
LAB_00254b9f:
          puVar13 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_6d8,(ulong)local_610);
        }
        puVar18 = puVar13 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar13 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar18) {
          local_6f8.field_2._M_allocated_capacity = *puVar18;
          local_6f8.field_2._8_8_ = puVar13[3];
          local_6f8._M_dataplus._M_p = (pointer)paVar25;
        }
        else {
          local_6f8.field_2._M_allocated_capacity = *puVar18;
          local_6f8._M_dataplus._M_p = (pointer)*puVar13;
        }
        local_6f8._M_string_length = puVar13[1];
        *puVar13 = puVar18;
        puVar13[1] = 0;
        *(undefined1 *)puVar18 = 0;
        plVar14 = (long *)std::__cxx11::string::append((char *)&local_6f8);
        local_598._0_8_ = &local_588;
        paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar14 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar14 == paVar20) {
          local_588 = *paVar20;
        }
        else {
          local_588._M_allocated_capacity = paVar20->_M_allocated_capacity;
          local_598._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*plVar14;
        }
        local_598._8_8_ = plVar14[1];
        *plVar14 = (long)paVar20;
        plVar14[1] = 0;
        *(undefined1 *)(plVar14 + 2) = 0;
        plVar14 = (long *)std::__cxx11::string::_M_append
                                    (local_598,(ulong)local_660._M_dataplus._M_p);
        p_Var32 = (_WordT *)(plVar14 + 2);
        if ((_WordT *)*plVar14 == p_Var32) {
          local_4c8._16_8_ = *p_Var32;
          local_4c8._24_8_ = plVar14[3];
          local_4c8._0_8_ = local_4c8 + 0x10;
        }
        else {
          local_4c8._16_8_ = *p_Var32;
          local_4c8._0_8_ = (_WordT *)*plVar14;
        }
        local_4c8._8_8_ = plVar14[1];
        *plVar14 = (long)p_Var32;
        plVar14[1] = 0;
        *(undefined1 *)(plVar14 + 2) = 0;
        std::__cxx11::string::operator=((string *)&local_660,(string *)local_4c8);
        if ((undefined1 *)local_4c8._0_8_ != local_4c8 + 0x10) {
          operator_delete((void *)local_4c8._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_598._0_8_ != &local_588) {
          operator_delete((void *)local_598._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_6f8._M_dataplus._M_p != paVar25) goto LAB_0025559a;
      }
      if (local_610 != &local_600) {
        operator_delete(local_610);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6d8._M_dataplus._M_p != &local_6d8.field_2) {
        operator_delete(local_6d8._M_dataplus._M_p);
      }
      if ((ulong *)local_640._M_w != &local_630) {
        operator_delete((void *)local_640._M_w);
      }
      if (local_690 != &local_680) {
        operator_delete(local_690);
      }
      if (local_5b8 != &local_5a8) {
        operator_delete(local_5b8);
      }
      local_6f8._M_dataplus._M_p = (pointer)&local_6f8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_6f8,"");
      uVar5 = local_408;
      local_5f0 = local_698;
      genAggLoopStringCompressed
                ((string *)local_4c8,this,node_00,local_408,local_698,local_138,0,&local_6f8);
      std::__cxx11::string::_M_append((char *)&local_6b8,local_4c8._0_8_);
      if ((undefined1 *)local_4c8._0_8_ != local_4c8 + 0x10) {
        operator_delete((void *)local_4c8._0_8_);
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_598,
                     &local_6f8,&local_6b8);
      puVar13 = (undefined8 *)
                std::__cxx11::string::_M_append((char *)local_598,(ulong)local_660._M_dataplus._M_p)
      ;
      local_4c8._0_8_ = local_4c8 + 0x10;
      p_Var32 = puVar13 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar13 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)p_Var32) {
        local_4c8._16_8_ = *p_Var32;
        local_4c8._24_8_ = puVar13[3];
      }
      else {
        local_4c8._16_8_ = *p_Var32;
        local_4c8._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*puVar13;
      }
      local_4c8._8_8_ = puVar13[1];
      *puVar13 = p_Var32;
      puVar13[1] = 0;
      *(undefined1 *)(puVar13 + 2) = 0;
      std::__cxx11::string::_M_append((char *)local_670,local_4c8._0_8_);
      if ((undefined1 *)local_4c8._0_8_ != local_4c8 + 0x10) {
        operator_delete((void *)local_4c8._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_598._0_8_ != &local_588) {
        operator_delete((void *)local_598._0_8_);
      }
      if (multifaq::cppgen::COMPRESS_AGGREGATES == '\0') {
        pvVar27 = (this->newAggregateRegister).
                  super__Vector_base<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pAVar29 = pvVar27[local_408].super__Vector_base<AggRegTuple,_std::allocator<AggRegTuple>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        if (*(pointer *)
             ((long)&pvVar27[local_408].
                     super__Vector_base<AggRegTuple,_std::allocator<AggRegTuple>_>._M_impl.
                     super__Vector_impl_data + 8) != pAVar29) {
          uVar39 = 0;
          do {
            sVar37 = local_698;
            if (pAVar29[uVar39].postLoopAgg == true) {
              local_640._M_w = (_WordT)&local_630;
              std::__cxx11::string::_M_construct
                        ((ulong)&local_640,((char)local_668 + (char)local_698) * '\x03');
              puVar13 = (undefined8 *)std::__cxx11::string::append((char *)&local_640);
              local_6d8._M_dataplus._M_p = (pointer)&local_6d8.field_2;
              puVar18 = puVar13 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar13 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar18) {
                local_6d8.field_2._M_allocated_capacity = *puVar18;
                local_6d8.field_2._8_8_ = puVar13[3];
              }
              else {
                local_6d8.field_2._M_allocated_capacity = *puVar18;
                local_6d8._M_dataplus._M_p = (pointer)*puVar13;
              }
              local_6d8._M_string_length = puVar13[1];
              *puVar13 = puVar18;
              puVar13[1] = 0;
              *(undefined1 *)(puVar13 + 2) = 0;
              uVar19 = this->aggregateCounter;
              cVar46 = '\x01';
              if (9 < uVar19) {
                uVar26 = uVar19;
                cVar65 = '\x04';
                do {
                  cVar46 = cVar65;
                  if (uVar26 < 100) {
                    cVar46 = cVar46 + -2;
                    goto LAB_002559ba;
                  }
                  if (uVar26 < 1000) {
                    cVar46 = cVar46 + -1;
                    goto LAB_002559ba;
                  }
                  if (uVar26 < 10000) goto LAB_002559ba;
                  bVar10 = 99999 < uVar26;
                  uVar26 = uVar26 / 10000;
                  cVar65 = cVar46 + '\x04';
                } while (bVar10);
                cVar46 = cVar46 + '\x01';
              }
LAB_002559ba:
              local_690 = &local_680;
              std::__cxx11::string::_M_construct((ulong)&local_690,cVar46);
              std::__detail::__to_chars_10_impl<unsigned_long>
                        ((char *)local_690,(uint)local_688,uVar19);
              uVar31 = 0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_6d8._M_dataplus._M_p != &local_6d8.field_2) {
                uVar31 = local_6d8.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar31 < local_688 + local_6d8._M_string_length) {
                uVar19 = 0xf;
                if (local_690 != &local_680) {
                  uVar19 = local_680;
                }
                if (uVar19 < local_688 + local_6d8._M_string_length) goto LAB_00255a45;
                puVar13 = (undefined8 *)
                          std::__cxx11::string::replace
                                    ((ulong)&local_690,0,(char *)0x0,
                                     (ulong)local_6d8._M_dataplus._M_p);
              }
              else {
LAB_00255a45:
                puVar13 = (undefined8 *)
                          std::__cxx11::string::_M_append((char *)&local_6d8,(ulong)local_690);
              }
              local_598._0_8_ = &local_588;
              paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(puVar13 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar13 == paVar25) {
                local_588._M_local_buf = *(char (*) [16])paVar25;
              }
              else {
                local_588._M_allocated_capacity = paVar25->_M_allocated_capacity;
                local_598._0_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)*puVar13;
              }
              local_598._8_8_ = puVar13[1];
              *puVar13 = paVar25;
              puVar13[1] = 0;
              paVar25->_M_local_buf[0] = '\0';
              puVar13 = (undefined8 *)std::__cxx11::string::append(local_598);
              local_4c8._0_8_ = local_4c8 + 0x10;
              p_Var32 = puVar13 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar13 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)p_Var32) {
                local_4c8._16_8_ = *p_Var32;
                local_4c8._24_8_ = puVar13[3];
              }
              else {
                local_4c8._16_8_ = *p_Var32;
                local_4c8._0_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)*puVar13;
              }
              local_4c8._8_8_ = puVar13[1];
              *puVar13 = p_Var32;
              puVar13[1] = 0;
              *(undefined1 *)(puVar13 + 2) = 0;
              std::__cxx11::string::_M_append((char *)local_670,local_4c8._0_8_);
              if ((undefined1 *)local_4c8._0_8_ != local_4c8 + 0x10) {
                operator_delete((void *)local_4c8._0_8_);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_598._0_8_ != &local_588) {
                operator_delete((void *)local_598._0_8_);
              }
              if (local_690 != &local_680) {
                operator_delete(local_690);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_6d8._M_dataplus._M_p != &local_6d8.field_2) {
                operator_delete(local_6d8._M_dataplus._M_p);
              }
              if ((ulong *)local_640._M_w != &local_630) {
                operator_delete((void *)local_640._M_w);
              }
              pAVar29 = pAVar29 + uVar39;
              if ((pAVar29->previous).first <
                  (ulong)((long)(this->listOfLoops).
                                super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->listOfLoops).
                                super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 5)) {
                uVar19 = *(ulong *)(*(long *)(*(long *)&(this->newAggregateRemapping).
                                                                                                                
                                                  super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[sVar37].
                                                  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                                  ._M_impl.super__Vector_impl_data +
                                             (pAVar29->previous).first * 0x18) +
                                   (pAVar29->previous).second * 8);
                cVar46 = '\x01';
                local_4c8._0_8_ = local_4c8 + 0x10;
                if (9 < uVar19) {
                  uVar26 = uVar19;
                  cVar65 = '\x04';
                  do {
                    cVar46 = cVar65;
                    if (uVar26 < 100) {
                      cVar46 = cVar46 + -2;
                      goto LAB_00255c73;
                    }
                    if (uVar26 < 1000) {
                      cVar46 = cVar46 + -1;
                      goto LAB_00255c73;
                    }
                    if (uVar26 < 10000) goto LAB_00255c73;
                    bVar10 = 99999 < uVar26;
                    uVar26 = uVar26 / 10000;
                    cVar65 = cVar46 + '\x04';
                  } while (bVar10);
                  cVar46 = cVar46 + '\x01';
                }
LAB_00255c73:
                std::__cxx11::string::_M_construct((ulong)local_4c8,cVar46);
                std::__detail::__to_chars_10_impl<unsigned_long>
                          ((char *)local_4c8._0_8_,local_4c8._8_4_,uVar19);
                std::operator+(&local_6d8,"aggregateRegister[",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_4c8);
                plVar14 = (long *)std::__cxx11::string::append((char *)&local_6d8);
                paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(plVar14 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar14 == paVar25) {
                  local_588 = *paVar25;
                  local_598._0_8_ = &local_588;
                }
                else {
                  local_588._M_allocated_capacity = paVar25->_M_allocated_capacity;
                  local_598._0_8_ =
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)*plVar14;
                }
                local_598._8_8_ = plVar14[1];
                *plVar14 = (long)paVar25;
                plVar14[1] = 0;
                *(undefined1 *)(plVar14 + 2) = 0;
                std::__cxx11::string::_M_append((char *)local_670,local_598._0_8_);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_598._0_8_ != &local_588) {
                  operator_delete((void *)local_598._0_8_);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_6d8._M_dataplus._M_p != &local_6d8.field_2) {
                  operator_delete(local_6d8._M_dataplus._M_p);
                }
                if ((undefined1 *)local_4c8._0_8_ != local_4c8 + 0x10) {
                  operator_delete((void *)local_4c8._0_8_);
                }
              }
              if ((pAVar29->postLoop).first <
                  (ulong)((long)(this->listOfLoops).
                                super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->listOfLoops).
                                super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 5)) {
                uVar19 = *(ulong *)(*(long *)(*(long *)&(this->newAggregateRemapping).
                                                                                                                
                                                  super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start
                                                  [local_698].
                                                  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                                  ._M_impl.super__Vector_impl_data +
                                             (pAVar29->postLoop).first * 0x18) +
                                   (pAVar29->postLoop).second * 8);
                cVar46 = '\x01';
                local_4c8._0_8_ = local_4c8 + 0x10;
                if (9 < uVar19) {
                  uVar26 = uVar19;
                  cVar65 = '\x04';
                  do {
                    cVar46 = cVar65;
                    if (uVar26 < 100) {
                      cVar46 = cVar46 + -2;
                      goto LAB_00255e25;
                    }
                    if (uVar26 < 1000) {
                      cVar46 = cVar46 + -1;
                      goto LAB_00255e25;
                    }
                    if (uVar26 < 10000) goto LAB_00255e25;
                    bVar10 = 99999 < uVar26;
                    uVar26 = uVar26 / 10000;
                    cVar65 = cVar46 + '\x04';
                  } while (bVar10);
                  cVar46 = cVar46 + '\x01';
                }
LAB_00255e25:
                std::__cxx11::string::_M_construct((ulong)local_4c8,cVar46);
                std::__detail::__to_chars_10_impl<unsigned_long>
                          ((char *)local_4c8._0_8_,local_4c8._8_4_,uVar19);
                std::operator+(&local_6d8,"aggregateRegister[",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_4c8);
                plVar14 = (long *)std::__cxx11::string::append((char *)&local_6d8);
                paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(plVar14 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar14 == paVar25) {
                  local_588 = *paVar25;
                  local_598._0_8_ = &local_588;
                }
                else {
                  local_588._M_allocated_capacity = paVar25->_M_allocated_capacity;
                  local_598._0_8_ =
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)*plVar14;
                }
                local_598._8_8_ = plVar14[1];
                *plVar14 = (long)paVar25;
                plVar14[1] = 0;
                *(undefined1 *)(plVar14 + 2) = 0;
                std::__cxx11::string::_M_append((char *)local_670,local_598._0_8_);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_598._0_8_ != &local_588) {
                  operator_delete((void *)local_598._0_8_);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_6d8._M_dataplus._M_p != &local_6d8.field_2) {
                  operator_delete(local_6d8._M_dataplus._M_p);
                }
                if ((undefined1 *)local_4c8._0_8_ != local_4c8 + 0x10) {
                  operator_delete((void *)local_4c8._0_8_);
                }
              }
              psVar9 = local_670;
              std::__cxx11::string::pop_back();
              std::__cxx11::string::append((char *)psVar9);
              *(size_t *)
               (*(long *)(*(long *)&(this->newAggregateRemapping).
                                    super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[local_698].
                                    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                    ._M_impl.super__Vector_impl_data + local_408 * 0x18) +
               uVar39 * 8) = this->aggregateCounter;
              this->aggregateCounter = this->aggregateCounter + 1;
            }
            uVar39 = uVar39 + 1;
            pvVar27 = (this->newAggregateRegister).
                      super__Vector_base<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pAVar29 = pvVar27[local_408].
                      super__Vector_base<AggRegTuple,_std::allocator<AggRegTuple>_>._M_impl.
                      super__Vector_impl_data._M_start;
          } while (uVar39 < (ulong)(((long)*(pointer *)
                                            ((long)&pvVar27[local_408].
                                                                                                        
                                                  super__Vector_base<AggRegTuple,_std::allocator<AggRegTuple>_>
                                                  ._M_impl.super__Vector_impl_data + 8) -
                                     (long)pAVar29 >> 4) * 0x6db6db6db6db6db7));
        }
      }
      else {
        uVar39 = 0;
        local_4c8._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        auVar7._8_8_ = 0;
        auVar7._0_8_ = local_598._8_8_;
        local_598 = auVar7 << 0x40;
        local_640._M_w = 0;
        local_690 = (ulong *)0x0;
        pvVar27 = (this->newAggregateRegister).
                  super__Vector_base<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pAVar29 = pvVar27[uVar5].super__Vector_base<AggRegTuple,_std::allocator<AggRegTuple>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        if (*(pointer *)
             ((long)&pvVar27[uVar5].super__Vector_base<AggRegTuple,_std::allocator<AggRegTuple>_>.
                     _M_impl.super__Vector_impl_data + 8) == pAVar29) {
          local_5c0 = 0;
        }
        else {
          pvVar42 = (this->newAggregateRemapping).
                    super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + local_5f0;
          local_5c0 = 0;
          uVar39 = 0;
          do {
            bVar10 = pAVar29[uVar39].postLoopAgg;
            if (bVar10 == true) {
              mapAggregateToIndexes
                        (this,(AggregateIndexes *)local_598,pAVar29 + uVar39,&local_698,&local_408);
              sVar37 = this->aggregateCounter;
              *(size_t *)
               (*(long *)(*(long *)&(pvVar42->
                                    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                    )._M_impl.super__Vector_impl_data + uVar5 * 0x18) + uVar39 * 8)
                   = sVar37;
              this->aggregateCounter = this->aggregateCounter + 1;
              uVar39 = uVar39 + 1;
              local_5c0 = CONCAT71((int7)(sVar37 >> 8),1);
            }
            if (bVar10 != false) break;
            uVar39 = uVar39 + 1;
            pAVar29 = pvVar27[uVar5].super__Vector_base<AggRegTuple,_std::allocator<AggRegTuple>_>.
                      _M_impl.super__Vector_impl_data._M_start;
          } while (uVar39 < (ulong)(((long)*(pointer *)
                                            ((long)&pvVar27[uVar5].
                                                                                                        
                                                  super__Vector_base<AggRegTuple,_std::allocator<AggRegTuple>_>
                                                  ._M_impl.super__Vector_impl_data + 8) -
                                     (long)pAVar29 >> 4) * 0x6db6db6db6db6db7));
        }
        pvVar27 = (this->newAggregateRegister).
                  super__Vector_base<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        lVar11 = *(long *)&pvVar27[uVar5].
                           super__Vector_base<AggRegTuple,_std::allocator<AggRegTuple>_>._M_impl.
                           super__Vector_impl_data;
        if (uVar39 < (ulong)(((long)*(pointer *)
                                     ((long)&pvVar27[uVar5].
                                             super__Vector_base<AggRegTuple,_std::allocator<AggRegTuple>_>
                                             ._M_impl.super__Vector_impl_data + 8) - lVar11 >> 4) *
                            0x6db6db6db6db6db7)) {
          local_58 = (long)(local_668->super__Base_bitset<24UL>)._M_w + local_5f0;
          lVar44 = uVar39 * 0x70;
          do {
            if (*(char *)(lVar11 + 0x40 + lVar44) == '\x01') {
              local_568 = (undefined1  [16])0x0;
              local_578 = (undefined1  [16])0x0;
              local_588 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           )0x0;
              local_598 = (undefined1  [16])0x0;
              local_558 = 0;
              mapAggregateToIndexes
                        (this,(AggregateIndexes *)local_598,(AggRegTuple *)(lVar11 + lVar44),
                         &local_698,&local_408);
              bVar10 = AggregateIndexes::isIncrement
                                 ((AggregateIndexes *)local_598,(AggregateIndexes *)local_4c8,
                                  (size_t *)&local_690,(bitset<7UL> *)&local_640);
              if (bVar10) {
                local_690 = (ulong *)((long)local_690 + 1);
              }
              else {
                outputAggRegTupleString_abi_cxx11_
                          (&local_6d8,this,(AggregateIndexes *)local_4c8,(size_t)local_690,
                           (bitset<7UL> *)&local_640,local_58,true);
                std::__cxx11::string::_M_append((char *)local_670,(ulong)local_6d8._M_dataplus._M_p)
                ;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_6d8._M_dataplus._M_p != &local_6d8.field_2) {
                  operator_delete(local_6d8._M_dataplus._M_p);
                }
                p_Var32 = (_WordT *)local_598;
                pAVar33 = (AggregateIndexes *)local_4c8;
                for (lVar11 = 9; lVar11 != 0; lVar11 = lVar11 + -1) {
                  (pAVar33->present).super__Base_bitset<1UL>._M_w = *p_Var32;
                  p_Var32 = p_Var32 + (ulong)bVar43 * -2 + 1;
                  pAVar33 = (AggregateIndexes *)((long)pAVar33 + (ulong)bVar43 * -0x10 + 8);
                }
                local_690 = (ulong *)0x0;
              }
              *(size_t *)
               (*(long *)(*(long *)&(this->newAggregateRemapping).
                                    super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[local_5f0].
                                    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                    ._M_impl.super__Vector_impl_data + uVar5 * 0x18) + uVar39 * 8) =
                   this->aggregateCounter;
              this->aggregateCounter = this->aggregateCounter + 1;
            }
            uVar39 = uVar39 + 1;
            pvVar27 = (this->newAggregateRegister).
                      super__Vector_base<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            lVar11 = *(long *)&pvVar27[uVar5].
                               super__Vector_base<AggRegTuple,_std::allocator<AggRegTuple>_>._M_impl
                               .super__Vector_impl_data;
            lVar44 = lVar44 + 0x70;
          } while (uVar39 < (ulong)(((long)*(pointer *)
                                            ((long)&pvVar27[uVar5].
                                                                                                        
                                                  super__Vector_base<AggRegTuple,_std::allocator<AggRegTuple>_>
                                                  ._M_impl.super__Vector_impl_data + 8) - lVar11 >>
                                    4) * 0x6db6db6db6db6db7));
        }
        if ((local_5c0 & 1) != 0) {
          outputAggRegTupleString_abi_cxx11_
                    (&local_6d8,this,(AggregateIndexes *)local_4c8,(size_t)local_690,
                     (bitset<7UL> *)&local_640,
                     (long)(local_668->super__Base_bitset<24UL>)._M_w + local_5f0,true);
          std::__cxx11::string::_M_append((char *)local_670,(ulong)local_6d8._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_6d8._M_dataplus._M_p != &local_6d8.field_2) {
            operator_delete(local_6d8._M_dataplus._M_p);
          }
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6f8._M_dataplus._M_p != &local_6f8.field_2) {
        operator_delete(local_6f8._M_dataplus._M_p);
      }
      uVar39 = local_60;
      pdVar41 = local_a8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_660._M_dataplus._M_p != &local_660.field_2) {
        operator_delete(local_660._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6b8._M_dataplus._M_p != &local_6b8.field_2) {
        operator_delete(local_6b8._M_dataplus._M_p);
      }
      if (local_611 == '\0') break;
      uVar39 = uVar39 + 1;
      pvVar4 = (this->nextLoopsPerLoop).
               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar16 = pvVar4[local_620].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_start;
    } while (uVar39 < (ulong)((long)*(pointer *)
                                     ((long)&pvVar4[local_620].
                                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                             ._M_impl.super__Vector_impl_data + 8) - (long)puVar16
                             >> 3));
  }
  sVar37 = local_620;
  local_5f0 = this->aggregateCounter;
  if (multifaq::cppgen::COMPRESS_AGGREGATES == '\0') {
    pvVar27 = (this->newAggregateRegister).
              super__Vector_base<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pAVar29 = pvVar27[local_620].super__Vector_base<AggRegTuple,_std::allocator<AggRegTuple>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (*(pointer *)
         ((long)&pvVar27[local_620].super__Vector_base<AggRegTuple,_std::allocator<AggRegTuple>_>.
                 _M_impl.super__Vector_impl_data + 8) != pAVar29) {
      local_668 = (pointer)(local_5e8 + 3);
      paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_4c8 + 0x10);
      uVar39 = 0;
      do {
        if (pAVar29[uVar39].postLoopAgg == false) {
          local_660._M_dataplus._M_p = (pointer)&local_660.field_2;
          std::__cxx11::string::_M_construct
                    ((ulong)&local_660,((char)local_698 + (char)local_668) * '\x03');
          puVar13 = (undefined8 *)std::__cxx11::string::append((char *)&local_660);
          local_6b8._M_dataplus._M_p = (pointer)&local_6b8.field_2;
          puVar18 = puVar13 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar13 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar18) {
            local_6b8.field_2._M_allocated_capacity = *puVar18;
            local_6b8.field_2._8_8_ = puVar13[3];
          }
          else {
            local_6b8.field_2._M_allocated_capacity = *puVar18;
            local_6b8._M_dataplus._M_p = (pointer)*puVar13;
          }
          local_6b8._M_string_length = puVar13[1];
          *puVar13 = puVar18;
          puVar13[1] = 0;
          *(undefined1 *)(puVar13 + 2) = 0;
          uVar19 = this->aggregateCounter;
          cVar46 = '\x01';
          if (9 < uVar19) {
            uVar26 = uVar19;
            cVar65 = '\x04';
            do {
              cVar46 = cVar65;
              if (uVar26 < 100) {
                cVar46 = cVar46 + -2;
                goto LAB_002566a4;
              }
              if (uVar26 < 1000) {
                cVar46 = cVar46 + -1;
                goto LAB_002566a4;
              }
              if (uVar26 < 10000) goto LAB_002566a4;
              bVar10 = 99999 < uVar26;
              uVar26 = uVar26 / 10000;
              cVar65 = cVar46 + '\x04';
            } while (bVar10);
            cVar46 = cVar46 + '\x01';
          }
LAB_002566a4:
          local_6f8._M_dataplus._M_p = (pointer)&local_6f8.field_2;
          std::__cxx11::string::_M_construct((ulong)&local_6f8,cVar46);
          std::__detail::__to_chars_10_impl<unsigned_long>
                    (local_6f8._M_dataplus._M_p,(uint)local_6f8._M_string_length,uVar19);
          uVar31 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_6b8._M_dataplus._M_p != &local_6b8.field_2) {
            uVar31 = local_6b8.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar31 < local_6f8._M_string_length + local_6b8._M_string_length) {
            uVar31 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_6f8._M_dataplus._M_p != &local_6f8.field_2) {
              uVar31 = local_6f8.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar31 < local_6f8._M_string_length + local_6b8._M_string_length)
            goto LAB_00256714;
            puVar13 = (undefined8 *)
                      std::__cxx11::string::replace
                                ((ulong)&local_6f8,0,(char *)0x0,(ulong)local_6b8._M_dataplus._M_p);
          }
          else {
LAB_00256714:
            puVar13 = (undefined8 *)
                      std::__cxx11::string::_M_append
                                ((char *)&local_6b8,(ulong)local_6f8._M_dataplus._M_p);
          }
          paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar13 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar13 == paVar20) {
            local_588._M_local_buf = *(char (*) [16])paVar20;
            local_598._0_8_ = &local_588;
          }
          else {
            local_588._M_allocated_capacity = paVar20->_M_allocated_capacity;
            local_598._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*puVar13;
          }
          local_598._8_8_ = puVar13[1];
          *puVar13 = paVar20;
          puVar13[1] = 0;
          paVar20->_M_local_buf[0] = '\0';
          puVar13 = (undefined8 *)std::__cxx11::string::append(local_598);
          p_Var32 = puVar13 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar13 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)p_Var32) {
            local_4c8._16_8_ = *p_Var32;
            local_4c8._24_8_ = puVar13[3];
            local_4c8._0_8_ = paVar25;
          }
          else {
            local_4c8._16_8_ = *p_Var32;
            local_4c8._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*puVar13;
          }
          local_4c8._8_8_ = puVar13[1];
          *puVar13 = p_Var32;
          puVar13[1] = 0;
          *(undefined1 *)(puVar13 + 2) = 0;
          std::__cxx11::string::_M_append((char *)local_670,local_4c8._0_8_);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4c8._0_8_ != paVar25) {
            operator_delete((void *)local_4c8._0_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_598._0_8_ != &local_588) {
            operator_delete((void *)local_598._0_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_6f8._M_dataplus._M_p != &local_6f8.field_2) {
            operator_delete(local_6f8._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_6b8._M_dataplus._M_p != &local_6b8.field_2) {
            operator_delete(local_6b8._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_660._M_dataplus._M_p != &local_660.field_2) {
            operator_delete(local_660._M_dataplus._M_p);
          }
          pAVar29 = pAVar29 + uVar39;
          if ((pAVar29->previous).first <
              (ulong)((long)(this->listOfLoops).
                            super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->listOfLoops).
                            super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5)) {
            uVar19 = *(ulong *)(*(long *)(*(long *)&(this->newAggregateRemapping).
                                                                                                        
                                                  super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start
                                                  [pAVar29->prevDepth].
                                                  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                                  ._M_impl.super__Vector_impl_data +
                                         (pAVar29->previous).first * 0x18) +
                               (pAVar29->previous).second * 8);
            cVar46 = '\x01';
            if (9 < uVar19) {
              uVar26 = uVar19;
              cVar65 = '\x04';
              do {
                cVar46 = cVar65;
                if (uVar26 < 100) {
                  cVar46 = cVar46 + -2;
                  goto LAB_00256911;
                }
                if (uVar26 < 1000) {
                  cVar46 = cVar46 + -1;
                  goto LAB_00256911;
                }
                if (uVar26 < 10000) goto LAB_00256911;
                bVar10 = 99999 < uVar26;
                uVar26 = uVar26 / 10000;
                cVar65 = cVar46 + '\x04';
              } while (bVar10);
              cVar46 = cVar46 + '\x01';
            }
LAB_00256911:
            local_4c8._0_8_ = paVar25;
            std::__cxx11::string::_M_construct((ulong)local_4c8,cVar46);
            std::__detail::__to_chars_10_impl<unsigned_long>
                      ((char *)local_4c8._0_8_,local_4c8._8_4_,uVar19);
            std::operator+(&local_6b8,"aggregateRegister[",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_4c8);
            puVar13 = (undefined8 *)std::__cxx11::string::append((char *)&local_6b8);
            paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar13 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar13 == paVar20) {
              local_588 = *paVar20;
              local_598._0_8_ = &local_588;
            }
            else {
              local_588._M_allocated_capacity = paVar20->_M_allocated_capacity;
              local_598._0_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*puVar13;
            }
            local_598._8_8_ = puVar13[1];
            *puVar13 = paVar20;
            puVar13[1] = 0;
            *(undefined1 *)(puVar13 + 2) = 0;
            std::__cxx11::string::_M_append((char *)local_670,local_598._0_8_);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_598._0_8_ != &local_588) {
              operator_delete((void *)local_598._0_8_);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_6b8._M_dataplus._M_p != &local_6b8.field_2) {
              operator_delete(local_6b8._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4c8._0_8_ != paVar25) {
              operator_delete((void *)local_4c8._0_8_);
            }
          }
          if ((pAVar29->product).first == true) {
            uVar19 = *(ulong *)(*(long *)&(this->localProductRemapping).
                                          super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start[local_620].
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          ._M_impl.super__Vector_impl_data +
                               (pAVar29->product).second * 8);
            cVar46 = '\x01';
            if (9 < uVar19) {
              uVar26 = uVar19;
              cVar65 = '\x04';
              do {
                cVar46 = cVar65;
                if (uVar26 < 100) {
                  cVar46 = cVar46 + -2;
                  goto LAB_00256a99;
                }
                if (uVar26 < 1000) {
                  cVar46 = cVar46 + -1;
                  goto LAB_00256a99;
                }
                if (uVar26 < 10000) goto LAB_00256a99;
                bVar10 = 99999 < uVar26;
                uVar26 = uVar26 / 10000;
                cVar65 = cVar46 + '\x04';
              } while (bVar10);
              cVar46 = cVar46 + '\x01';
            }
LAB_00256a99:
            local_4c8._0_8_ = paVar25;
            std::__cxx11::string::_M_construct((ulong)local_4c8,cVar46);
            std::__detail::__to_chars_10_impl<unsigned_long>
                      ((char *)local_4c8._0_8_,local_4c8._8_4_,uVar19);
            std::operator+(&local_6b8,"localRegister[",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_4c8);
            puVar13 = (undefined8 *)std::__cxx11::string::append((char *)&local_6b8);
            paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar13 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar13 == paVar20) {
              local_588 = *paVar20;
              local_598._0_8_ = &local_588;
            }
            else {
              local_588._M_allocated_capacity = paVar20->_M_allocated_capacity;
              local_598._0_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*puVar13;
            }
            local_598._8_8_ = puVar13[1];
            *puVar13 = paVar20;
            puVar13[1] = 0;
            *(undefined1 *)(puVar13 + 2) = 0;
            std::__cxx11::string::_M_append((char *)local_670,local_598._0_8_);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_598._0_8_ != &local_588) {
              operator_delete((void *)local_598._0_8_);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_6b8._M_dataplus._M_p != &local_6b8.field_2) {
              operator_delete(local_6b8._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4c8._0_8_ != paVar25) {
              operator_delete((void *)local_4c8._0_8_);
            }
          }
          if (pAVar29->newViewProduct == true) {
            uVar19 = *(ulong *)(*(long *)&(this->viewProductRemapping).
                                          super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start[local_620].
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          ._M_impl.super__Vector_impl_data +
                               (pAVar29->viewAgg).second * 8);
            cVar46 = '\x01';
            if (9 < uVar19) {
              uVar26 = uVar19;
              cVar65 = '\x04';
              do {
                cVar46 = cVar65;
                if (uVar26 < 100) {
                  cVar46 = cVar46 + -2;
                  goto LAB_00256d26;
                }
                if (uVar26 < 1000) {
                  cVar46 = cVar46 + -1;
                  goto LAB_00256d26;
                }
                if (uVar26 < 10000) goto LAB_00256d26;
                bVar10 = 99999 < uVar26;
                uVar26 = uVar26 / 10000;
                cVar65 = cVar46 + '\x04';
              } while (bVar10);
              cVar46 = cVar46 + '\x01';
            }
LAB_00256d26:
            local_4c8._0_8_ = paVar25;
            std::__cxx11::string::_M_construct((ulong)local_4c8,cVar46);
            std::__detail::__to_chars_10_impl<unsigned_long>
                      ((char *)local_4c8._0_8_,local_4c8._8_4_,uVar19);
            std::operator+(&local_6b8,"viewRegister[",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_4c8);
            puVar13 = (undefined8 *)std::__cxx11::string::append((char *)&local_6b8);
            paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar13 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar13 == paVar20) {
              local_588 = *paVar20;
              local_598._0_8_ = &local_588;
            }
            else {
              local_588._M_allocated_capacity = paVar20->_M_allocated_capacity;
              local_598._0_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*puVar13;
            }
            local_598._8_8_ = puVar13[1];
            *puVar13 = paVar20;
            puVar13[1] = 0;
            *(undefined1 *)(puVar13 + 2) = 0;
            std::__cxx11::string::_M_append((char *)local_670,local_598._0_8_);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_598._0_8_ != &local_588) {
              operator_delete((void *)local_598._0_8_);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_6b8._M_dataplus._M_p != &local_6b8.field_2) {
              operator_delete(local_6b8._M_dataplus._M_p);
            }
            _Var34._M_p = (pointer)local_4c8._0_8_;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4c8._0_8_ != paVar25) {
LAB_00256e20:
              operator_delete(_Var34._M_p);
            }
          }
          else {
            if (pAVar29->singleViewAgg != true) goto LAB_00256e25;
            std::operator+(&local_660,"aggregates_",this->viewName + (pAVar29->viewAgg).first);
            puVar13 = (undefined8 *)std::__cxx11::string::append((char *)&local_660);
            puVar18 = puVar13 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar13 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar18) {
              local_6b8.field_2._M_allocated_capacity = *puVar18;
              local_6b8.field_2._8_8_ = puVar13[3];
              local_6b8._M_dataplus._M_p = (pointer)&local_6b8.field_2;
            }
            else {
              local_6b8.field_2._M_allocated_capacity = *puVar18;
              local_6b8._M_dataplus._M_p = (pointer)*puVar13;
            }
            local_6b8._M_string_length = puVar13[1];
            *puVar13 = puVar18;
            puVar13[1] = 0;
            *(undefined1 *)(puVar13 + 2) = 0;
            uVar19 = (pAVar29->viewAgg).second;
            cVar46 = '\x01';
            if (9 < uVar19) {
              uVar26 = uVar19;
              cVar65 = '\x04';
              do {
                cVar46 = cVar65;
                if (uVar26 < 100) {
                  cVar46 = cVar46 + -2;
                  goto LAB_00257095;
                }
                if (uVar26 < 1000) {
                  cVar46 = cVar46 + -1;
                  goto LAB_00257095;
                }
                if (uVar26 < 10000) goto LAB_00257095;
                bVar10 = 99999 < uVar26;
                uVar26 = uVar26 / 10000;
                cVar65 = cVar46 + '\x04';
              } while (bVar10);
              cVar46 = cVar46 + '\x01';
            }
LAB_00257095:
            local_6f8._M_dataplus._M_p = (pointer)&local_6f8.field_2;
            std::__cxx11::string::_M_construct((ulong)&local_6f8,cVar46);
            std::__detail::__to_chars_10_impl<unsigned_long>
                      (local_6f8._M_dataplus._M_p,(uint)local_6f8._M_string_length,uVar19);
            uVar31 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_6b8._M_dataplus._M_p != &local_6b8.field_2) {
              uVar31 = local_6b8.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar31 < local_6f8._M_string_length + local_6b8._M_string_length) {
              uVar31 = 0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_6f8._M_dataplus._M_p != &local_6f8.field_2) {
                uVar31 = local_6f8.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar31 < local_6f8._M_string_length + local_6b8._M_string_length)
              goto LAB_00257105;
              puVar13 = (undefined8 *)
                        std::__cxx11::string::replace
                                  ((ulong)&local_6f8,0,(char *)0x0,(ulong)local_6b8._M_dataplus._M_p
                                  );
            }
            else {
LAB_00257105:
              puVar13 = (undefined8 *)
                        std::__cxx11::string::_M_append
                                  ((char *)&local_6b8,(ulong)local_6f8._M_dataplus._M_p);
            }
            paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar13 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar13 == paVar20) {
              local_588._M_local_buf = *(char (*) [16])paVar20;
              local_598._0_8_ = &local_588;
            }
            else {
              local_588._M_allocated_capacity = paVar20->_M_allocated_capacity;
              local_598._0_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*puVar13;
            }
            local_598._8_8_ = puVar13[1];
            *puVar13 = paVar20;
            puVar13[1] = 0;
            paVar20->_M_local_buf[0] = '\0';
            puVar13 = (undefined8 *)std::__cxx11::string::append(local_598);
            p_Var32 = puVar13 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar13 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)p_Var32) {
              local_4c8._16_8_ = *p_Var32;
              local_4c8._24_8_ = puVar13[3];
              local_4c8._0_8_ = paVar25;
            }
            else {
              local_4c8._16_8_ = *p_Var32;
              local_4c8._0_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*puVar13;
            }
            local_4c8._8_8_ = puVar13[1];
            *puVar13 = p_Var32;
            puVar13[1] = 0;
            *(undefined1 *)(puVar13 + 2) = 0;
            std::__cxx11::string::_M_append((char *)local_670,local_4c8._0_8_);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4c8._0_8_ != paVar25) {
              operator_delete((void *)local_4c8._0_8_);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_598._0_8_ != &local_588) {
              operator_delete((void *)local_598._0_8_);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_6f8._M_dataplus._M_p != &local_6f8.field_2) {
              operator_delete(local_6f8._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_6b8._M_dataplus._M_p != &local_6b8.field_2) {
              operator_delete(local_6b8._M_dataplus._M_p);
            }
            _Var34._M_p = local_660._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_660._M_dataplus._M_p != &local_660.field_2) goto LAB_00256e20;
          }
LAB_00256e25:
          if (pAVar29->multiplyByCount == true) {
            std::__cxx11::string::append((char *)local_670);
          }
          if ((pAVar29->postLoop).first <
              (ulong)((long)(this->listOfLoops).
                            super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->listOfLoops).
                            super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5)) {
            uVar19 = *(ulong *)(*(long *)(*(long *)&(this->newAggregateRemapping).
                                                                                                        
                                                  super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start
                                                  [local_698].
                                                  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                                  ._M_impl.super__Vector_impl_data +
                                         (pAVar29->postLoop).first * 0x18) +
                               (pAVar29->postLoop).second * 8);
            cVar46 = '\x01';
            if (9 < uVar19) {
              uVar26 = uVar19;
              cVar65 = '\x04';
              do {
                cVar46 = cVar65;
                if (uVar26 < 100) {
                  cVar46 = cVar46 + -2;
                  goto LAB_00256ef3;
                }
                if (uVar26 < 1000) {
                  cVar46 = cVar46 + -1;
                  goto LAB_00256ef3;
                }
                if (uVar26 < 10000) goto LAB_00256ef3;
                bVar10 = 99999 < uVar26;
                uVar26 = uVar26 / 10000;
                cVar65 = cVar46 + '\x04';
              } while (bVar10);
              cVar46 = cVar46 + '\x01';
            }
LAB_00256ef3:
            local_4c8._0_8_ = paVar25;
            std::__cxx11::string::_M_construct((ulong)local_4c8,cVar46);
            std::__detail::__to_chars_10_impl<unsigned_long>
                      ((char *)local_4c8._0_8_,local_4c8._8_4_,uVar19);
            std::operator+(&local_6b8,"aggregateRegister[",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_4c8);
            puVar13 = (undefined8 *)std::__cxx11::string::append((char *)&local_6b8);
            paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar13 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar13 == paVar20) {
              local_588 = *paVar20;
              local_598._0_8_ = &local_588;
            }
            else {
              local_588._M_allocated_capacity = paVar20->_M_allocated_capacity;
              local_598._0_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*puVar13;
            }
            local_598._8_8_ = puVar13[1];
            *puVar13 = paVar20;
            puVar13[1] = 0;
            *(undefined1 *)(puVar13 + 2) = 0;
            std::__cxx11::string::_M_append((char *)local_670,local_598._0_8_);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_598._0_8_ != &local_588) {
              operator_delete((void *)local_598._0_8_);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_6b8._M_dataplus._M_p != &local_6b8.field_2) {
              operator_delete(local_6b8._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4c8._0_8_ != paVar25) {
              operator_delete((void *)local_4c8._0_8_);
            }
          }
          psVar9 = local_670;
          std::__cxx11::string::pop_back();
          std::__cxx11::string::append((char *)psVar9);
          *(size_t *)
           (*(long *)(*(long *)&(this->newAggregateRemapping).
                                super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[local_698].
                                super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                ._M_impl.super__Vector_impl_data + local_620 * 0x18) + uVar39 * 8) =
               this->aggregateCounter;
          this->aggregateCounter = this->aggregateCounter + 1;
        }
        uVar39 = uVar39 + 1;
        pvVar27 = (this->newAggregateRegister).
                  super__Vector_base<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pAVar29 = pvVar27[local_620].super__Vector_base<AggRegTuple,_std::allocator<AggRegTuple>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      } while (uVar39 < (ulong)(((long)*(pointer *)
                                        ((long)&pvVar27[local_620].
                                                super__Vector_base<AggRegTuple,_std::allocator<AggRegTuple>_>
                                                ._M_impl.super__Vector_impl_data + 8) -
                                 (long)pAVar29 >> 4) * 0x6db6db6db6db6db7));
    }
  }
  else {
    uVar39 = 0;
    local_4c8._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = local_598._8_8_;
    local_598 = auVar8 << 0x40;
    local_660._M_dataplus._M_p = (pointer)0x0;
    local_6f8._M_dataplus._M_p = (pointer)0x0;
    pvVar27 = (this->newAggregateRegister).
              super__Vector_base<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pAVar29 = pvVar27[local_620].super__Vector_base<AggRegTuple,_std::allocator<AggRegTuple>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (*(pointer *)
         ((long)&pvVar27[local_620].super__Vector_base<AggRegTuple,_std::allocator<AggRegTuple>_>.
                 _M_impl.super__Vector_impl_data + 8) == pAVar29) {
      local_5c0 = 0;
    }
    else {
      pvVar42 = (this->newAggregateRemapping).
                super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + local_698;
      uVar19 = 0;
      uVar26 = 0;
      do {
        uVar39 = uVar26;
        if (pAVar29[uVar39].postLoopAgg == false) {
          pAVar33 = (AggregateIndexes *)local_4c8;
          mapAggregateToIndexes(this,pAVar33,pAVar29 + uVar39,&local_698,&local_620);
          *(size_t *)
           (*(long *)(*(long *)&(pvVar42->
                                super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                )._M_impl.super__Vector_impl_data + sVar37 * 0x18) + uVar39 * 8) =
               this->aggregateCounter;
          this->aggregateCounter = this->aggregateCounter + 1;
          uVar19 = CONCAT71((int7)((ulong)pAVar33 >> 8),1);
          break;
        }
        pAVar29 = pvVar27[local_620].super__Vector_base<AggRegTuple,_std::allocator<AggRegTuple>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        uVar26 = uVar39 + 1;
      } while (uVar39 + 1 <
               (ulong)(((long)*(pointer *)
                               ((long)&pvVar27[local_620].
                                       super__Vector_base<AggRegTuple,_std::allocator<AggRegTuple>_>
                                       ._M_impl.super__Vector_impl_data + 8) - (long)pAVar29 >> 4) *
                      0x6db6db6db6db6db7));
      uVar39 = uVar39 + 1;
      local_5c0 = uVar19;
    }
    sVar28 = local_698;
    pvVar27 = (this->newAggregateRegister).
              super__Vector_base<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    lVar11 = *(long *)&pvVar27[sVar37].super__Vector_base<AggRegTuple,_std::allocator<AggRegTuple>_>
                       ._M_impl.super__Vector_impl_data;
    if (uVar39 < (ulong)(((long)*(pointer *)
                                 ((long)&pvVar27[sVar37].
                                         super__Vector_base<AggRegTuple,_std::allocator<AggRegTuple>_>
                                         ._M_impl.super__Vector_impl_data + 8) - lVar11 >> 4) *
                        0x6db6db6db6db6db7)) {
      pvVar27 = pvVar27 + sVar37;
      local_668 = (pointer)(local_5e8 + local_698 + 3);
      lVar44 = uVar39 * 0x70;
      do {
        if (*(char *)(lVar11 + 0x40 + lVar44) == '\0') {
          local_568 = (undefined1  [16])0x0;
          local_578 = (undefined1  [16])0x0;
          local_588 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       )0x0;
          local_598 = (undefined1  [16])0x0;
          local_558 = 0;
          mapAggregateToIndexes
                    (this,(AggregateIndexes *)local_598,
                     (AggRegTuple *)
                     (*(long *)&(pvVar27->
                                super__Vector_base<AggRegTuple,_std::allocator<AggRegTuple>_>).
                                _M_impl.super__Vector_impl_data + lVar44),&local_698,&local_620);
          bVar10 = AggregateIndexes::isIncrement
                             ((AggregateIndexes *)local_598,(AggregateIndexes *)local_4c8,
                              (size_t *)&local_6f8,(bitset<7UL> *)&local_660);
          if (bVar10) {
            local_6f8._M_dataplus._M_p = local_6f8._M_dataplus._M_p + 1;
          }
          else {
            outputAggRegTupleString_abi_cxx11_
                      (&local_6b8,this,(AggregateIndexes *)local_4c8,
                       (size_t)local_6f8._M_dataplus._M_p,(bitset<7UL> *)&local_660,
                       (size_t)local_668,false);
            std::__cxx11::string::_M_append((char *)local_670,(ulong)local_6b8._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_6b8._M_dataplus._M_p != &local_6b8.field_2) {
              operator_delete(local_6b8._M_dataplus._M_p);
            }
            pAVar33 = (AggregateIndexes *)local_598;
            pAVar35 = (AggregateIndexes *)local_4c8;
            for (lVar11 = 9; lVar11 != 0; lVar11 = lVar11 + -1) {
              (pAVar35->present).super__Base_bitset<1UL>._M_w =
                   (pAVar33->present).super__Base_bitset<1UL>._M_w;
              pAVar33 = (AggregateIndexes *)((long)pAVar33 + (ulong)bVar43 * -0x10 + 8);
              pAVar35 = (AggregateIndexes *)((long)pAVar35 + (ulong)bVar43 * -0x10 + 8);
            }
            local_6f8._M_dataplus._M_p = (pointer)0x0;
          }
          *(size_t *)
           (*(long *)(*(long *)&(this->newAggregateRemapping).
                                super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[sVar28].
                                super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                ._M_impl.super__Vector_impl_data + sVar37 * 0x18) + uVar39 * 8) =
               this->aggregateCounter;
          this->aggregateCounter = this->aggregateCounter + 1;
        }
        uVar39 = uVar39 + 1;
        pvVar27 = (this->newAggregateRegister).
                  super__Vector_base<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + sVar37;
        lVar11 = *(long *)&(pvVar27->super__Vector_base<AggRegTuple,_std::allocator<AggRegTuple>_>).
                           _M_impl.super__Vector_impl_data;
        lVar44 = lVar44 + 0x70;
      } while (uVar39 < (ulong)(((long)*(pointer *)
                                        ((long)&(pvVar27->
                                                super__Vector_base<AggRegTuple,_std::allocator<AggRegTuple>_>
                                                )._M_impl.super__Vector_impl_data + 8) - lVar11 >> 4
                                ) * 0x6db6db6db6db6db7));
    }
    if ((local_5c0 & 1) != 0) {
      outputAggRegTupleString_abi_cxx11_
                (&local_6b8,this,(AggregateIndexes *)local_4c8,(size_t)local_6f8._M_dataplus._M_p,
                 (bitset<7UL> *)&local_660,local_5e8 + local_698 + 3,false);
      std::__cxx11::string::_M_append((char *)local_670,(ulong)local_6b8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6b8._M_dataplus._M_p != &local_6b8.field_2) {
        operator_delete(local_6b8._M_dataplus._M_p);
      }
    }
  }
  sVar37 = local_5f0;
  if (this->aggregateCounter <= local_5f0) goto LAB_00257971;
  cVar46 = '\x03';
  if (local_5e8 != 0) {
    cVar46 = (char)local_5e8 + '\x02';
  }
  local_6d8._M_dataplus._M_p = (pointer)&local_6d8.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_6d8,(cVar46 + (char)local_698) * '\x03');
  puVar13 = (undefined8 *)std::__cxx11::string::append((char *)&local_6d8);
  paVar25 = &local_6f8.field_2;
  puVar18 = puVar13 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar13 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar18) {
    local_6f8.field_2._M_allocated_capacity = *puVar18;
    local_6f8.field_2._8_8_ = puVar13[3];
    local_6f8._M_dataplus._M_p = (pointer)paVar25;
  }
  else {
    local_6f8.field_2._M_allocated_capacity = *puVar18;
    local_6f8._M_dataplus._M_p = (pointer)*puVar13;
  }
  local_6f8._M_string_length = puVar13[1];
  *puVar13 = puVar18;
  puVar13[1] = 0;
  *(undefined1 *)(puVar13 + 2) = 0;
  cVar46 = '\x01';
  if (9 < sVar37) {
    sVar28 = sVar37;
    cVar65 = '\x04';
    do {
      cVar46 = cVar65;
      if (sVar28 < 100) {
        cVar46 = cVar46 + -2;
        goto LAB_002575af;
      }
      if (sVar28 < 1000) {
        cVar46 = cVar46 + -1;
        goto LAB_002575af;
      }
      if (sVar28 < 10000) goto LAB_002575af;
      bVar10 = 99999 < sVar28;
      sVar28 = sVar28 / 10000;
      cVar65 = cVar46 + '\x04';
    } while (bVar10);
    cVar46 = cVar46 + '\x01';
  }
LAB_002575af:
  local_640._M_w = (_WordT)&local_630;
  std::__cxx11::string::_M_construct((ulong)&local_640,cVar46);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_640._M_w,(uint)local_638,sVar37);
  uVar31 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6f8._M_dataplus._M_p != paVar25) {
    uVar31 = local_6f8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar31 < local_638 + local_6f8._M_string_length) {
    uVar39 = 0xf;
    if ((ulong *)local_640._M_w != &local_630) {
      uVar39 = local_630;
    }
    if (uVar39 < local_638 + local_6f8._M_string_length) goto LAB_0025762a;
    puVar13 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_640,0,(char *)0x0,(ulong)local_6f8._M_dataplus._M_p);
  }
  else {
LAB_0025762a:
    puVar13 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_6f8,local_640._M_w);
  }
  local_660._M_dataplus._M_p = (pointer)&local_660.field_2;
  puVar18 = puVar13 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar13 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar18) {
    local_660.field_2._M_allocated_capacity = *puVar18;
    local_660.field_2._8_8_ = puVar13[3];
  }
  else {
    local_660.field_2._M_allocated_capacity = *puVar18;
    local_660._M_dataplus._M_p = (pointer)*puVar13;
  }
  local_660._M_string_length = puVar13[1];
  *puVar13 = puVar18;
  puVar13[1] = 0;
  *(undefined1 *)puVar18 = 0;
  puVar13 = (undefined8 *)std::__cxx11::string::append((char *)&local_660);
  paVar20 = &local_6b8.field_2;
  puVar18 = puVar13 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar13 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar18) {
    local_6b8.field_2._M_allocated_capacity = *puVar18;
    local_6b8.field_2._8_8_ = puVar13[3];
    local_6b8._M_dataplus._M_p = (pointer)paVar20;
  }
  else {
    local_6b8.field_2._M_allocated_capacity = *puVar18;
    local_6b8._M_dataplus._M_p = (pointer)*puVar13;
  }
  local_6b8._M_string_length = puVar13[1];
  *puVar13 = puVar18;
  puVar13[1] = 0;
  *(undefined1 *)(puVar13 + 2) = 0;
  uVar39 = this->aggregateCounter - sVar37;
  cVar46 = '\x01';
  if (9 < uVar39) {
    uVar19 = uVar39;
    cVar65 = '\x04';
    do {
      cVar46 = cVar65;
      if (uVar19 < 100) {
        cVar46 = cVar46 + -2;
        goto LAB_0025776a;
      }
      if (uVar19 < 1000) {
        cVar46 = cVar46 + -1;
        goto LAB_0025776a;
      }
      if (uVar19 < 10000) goto LAB_0025776a;
      bVar10 = 99999 < uVar19;
      uVar19 = uVar19 / 10000;
      cVar65 = cVar46 + '\x04';
    } while (bVar10);
    cVar46 = cVar46 + '\x01';
  }
LAB_0025776a:
  local_690 = &local_680;
  std::__cxx11::string::_M_construct((ulong)&local_690,cVar46);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_690,(uint)local_688,uVar39);
  uVar31 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6b8._M_dataplus._M_p != paVar20) {
    uVar31 = local_6b8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar31 < local_688 + local_6b8._M_string_length) {
    uVar39 = 0xf;
    if (local_690 != &local_680) {
      uVar39 = local_680;
    }
    if (uVar39 < local_688 + local_6b8._M_string_length) goto LAB_002577e4;
    puVar13 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_690,0,(char *)0x0,(ulong)local_6b8._M_dataplus._M_p);
  }
  else {
LAB_002577e4:
    puVar13 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_6b8,(ulong)local_690);
  }
  local_598._0_8_ = &local_588;
  paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar13 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar13 == paVar21) {
    local_588._M_local_buf = *(char (*) [16])paVar21;
  }
  else {
    local_588._M_allocated_capacity = paVar21->_M_allocated_capacity;
    local_598._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)*puVar13;
  }
  local_598._8_8_ = puVar13[1];
  *puVar13 = paVar21;
  puVar13[1] = 0;
  paVar21->_M_local_buf[0] = '\0';
  puVar13 = (undefined8 *)std::__cxx11::string::append(local_598);
  p_Var32 = puVar13 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar13 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)p_Var32) {
    local_4c8._16_8_ = *p_Var32;
    local_4c8._24_8_ = puVar13[3];
    local_4c8._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)(local_4c8 + 0x10);
  }
  else {
    local_4c8._16_8_ = *p_Var32;
    local_4c8._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)*puVar13;
  }
  local_4c8._8_8_ = puVar13[1];
  *puVar13 = p_Var32;
  puVar13[1] = 0;
  *(undefined1 *)(puVar13 + 2) = 0;
  std::__cxx11::string::_M_append((char *)resetString,local_4c8._0_8_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c8._0_8_ !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)(local_4c8 + 0x10)) {
    operator_delete((void *)local_4c8._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_598._0_8_ != &local_588) {
    operator_delete((void *)local_598._0_8_);
  }
  if (local_690 != &local_680) {
    operator_delete(local_690);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6b8._M_dataplus._M_p != paVar20) {
    operator_delete(local_6b8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_660._M_dataplus._M_p != &local_660.field_2) {
    operator_delete(local_660._M_dataplus._M_p);
  }
  if ((ulong *)local_640._M_w != &local_630) {
    operator_delete((void *)local_640._M_w);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6f8._M_dataplus._M_p != paVar25) {
    operator_delete(local_6f8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6d8._M_dataplus._M_p != &local_6d8.field_2) {
    operator_delete(local_6d8._M_dataplus._M_p);
  }
LAB_00257971:
  if (local_5e0 != local_5d0) {
    operator_delete(local_5e0);
  }
  return local_670;
}

Assistant:

std::string CppGenerator::genAggLoopStringCompressed(
    const TDNode& node, const size_t currentLoop,size_t depth,
    const dyn_bitset& contributingViews,const size_t numOfOutViewLoops,
    std::string& resetString)
{
    const size_t thisLoopID = currentLoop;
    const dyn_bitset& thisLoop = listOfLoops[thisLoopID];
    size_t numOfLoops = thisLoop.count() + numOfOutViewLoops;
    
    std::string returnString = "";
    std::string depthString = std::to_string(depth);
        
    // Print all products for this considered loop
    for (size_t prodID = 0; prodID < localProductList[thisLoopID].size(); ++prodID)
    {
        const prod_bitset& product = localProductList[thisLoopID][prodID];
        
        // std::cout << product << std::endl;
        
        bool decomposedProduct = false;
        std::string productString = "";

        // We now check if parts of the product have already been computed 
        if (product.count() > 1)
        {
            prod_bitset subProduct = product;
            prod_bitset removedFunctions;

            size_t subProductID;

            bool foundSubProduct = false;
            while (!foundSubProduct && subProduct.count() > 1)
            {
                size_t highestPosition = 0;
                // need to continue with this the next loop
                for (size_t f = NUM_OF_FUNCTIONS; f > 0; f--)
                {
                    if (subProduct[f])
                    {
                        highestPosition = f;
                        break;
                    }
                }
                
                subProduct.reset(highestPosition);
                removedFunctions.set(highestPosition);

                auto local_it = localProductMap[thisLoopID].find(subProduct);
                if (local_it != localProductMap[thisLoopID].end() &&
                    local_it->second < prodID)
                {
                    foundSubProduct = true;
                    subProductID = local_it->second;
                }
            }
            

            if (foundSubProduct)
            {
                std::string local = std::to_string(
                    localProductRemapping[thisLoopID][subProductID]);

                productString += "localRegister["+local+"]*";
                    
                auto local_it = localProductMap[thisLoopID].find(removedFunctions);
                if (local_it != localProductMap[thisLoopID].end() &&
                    local_it->second < prodID)
                {
                    foundSubProduct = false;
                    subProductID = local_it->second;

                    local = std::to_string(
                        localProductRemapping[thisLoopID][subProductID]);
                    productString += "localRegister["+local+"]";
                }
                else
                {
                    productString += genProductString(
                        node,contributingViews,removedFunctions);
                }

                decomposedProduct = true;
            }
        }
        
        // We turn the product into a string
        if (!decomposedProduct)
            productString += genProductString(node,contributingViews,product);

        returnString += offset(3+depth+numOfLoops)+"localRegister["+
            std::to_string(productCounter)+"] = "+productString + ";\n";
        
        // increment the counter and update the remapping array
        localProductRemapping[thisLoopID][prodID] = productCounter;
        ++productCounter;
    }

    for (size_t viewProd = 0; viewProd < viewProductList[thisLoopID].size(); ++viewProd)
    {   
        std::string viewProduct = "";
        for (const std::pair<size_t, size_t>& viewAgg : viewProductList[thisLoopID][viewProd])
        {
            viewProduct += "aggregates_"+viewName[viewAgg.first]+"["+
                std::to_string(viewAgg.second)+"]*";
        }   
        viewProduct.pop_back();

        returnString += offset(3+depth+numOfLoops)+
            "viewRegister["+std::to_string(viewCounter)+"] = "+
            viewProduct +";\n";

        // Increment the counter and update the remapping array
        viewProductRemapping[thisLoopID][viewProd] = viewCounter;
        ++viewCounter;
    }

    
    // Recurse to the next loop(s) if possible
    for (size_t next=0; next < nextLoopsPerLoop[thisLoopID].size(); ++next)
    {
        size_t nextLoop = nextLoopsPerLoop[thisLoopID][next];

        if (((listOfLoops[nextLoop] & thisLoop) == thisLoop))
        {
            size_t viewID = viewsPerLoop[nextLoop].find_first();

            std::string loopString = "", closeLoopString = "";
            if (viewID < _qc->numberOfViews())
            {
                loopString +=
                    offset(3+depth+numOfLoops)+"ptr_"+viewName[viewID]+
                    " = lowerptr_"+viewName[viewID]+"["+depthString+"];\n"+
                    offset(3+depth+numOfLoops)+"while(ptr_"+viewName[viewID]+
                    " <= upperptr_"+viewName[viewID]+"["+depthString+"])\n"+
                    offset(3+depth+numOfLoops)+"{\n"+
                    offset(4+depth+numOfLoops)+viewName[viewID]+
                    "_tuple &"+viewName[viewID]+"Tuple = "+viewName[viewID]+
                    "[ptr_"+viewName[viewID]+"];\n"+
                    offset(4+depth+numOfLoops)+"double *aggregates_"+viewName[viewID]+
                    " = "+viewName[viewID]+"Tuple.aggregates;\n";
                
                closeLoopString += offset(4+depth+numOfLoops)+"++ptr_"+viewName[viewID]+
                    ";\n"+offset(3+depth+numOfLoops)+"}\n"+closeLoopString;
            }
            else 
            {
                loopString +=
                    offset(3+depth+numOfLoops)+"ptr_"+node._name+
                    " = lowerptr_"+node._name+"["+depthString+"];\n"+
                    offset(3+depth+numOfLoops)+"while(ptr_"+node._name+
                    " <= upperptr_"+node._name+"["+depthString+"])\n"+
                    offset(3+depth+numOfLoops)+"{\n"+
                    offset(4+depth+numOfLoops)+node._name +
                    "_tuple &"+node._name+"Tuple = "+node._name+
                    "[ptr_"+node._name+"];\n";
                
                closeLoopString = offset(4+depth+numOfLoops)+"++ptr_"+node._name+";\n"+
                    offset(3+depth+numOfLoops)+"}\n"+closeLoopString;
            }

            std::string resetAggregates = "";

            loopString += genAggLoopStringCompressed(
                node, nextLoop, depth, contributingViews, 0, resetAggregates);

            returnString += resetAggregates + loopString + closeLoopString;

            if (COMPRESS_AGGREGATES)
            {                    
                // After recurse, add the aggregates that have been added with post FLAG
                AggregateIndexes bench, aggIdx;
                std::bitset<7> increasingIndexes;
                size_t aggID = 0, off = 0;

                bool addedAggregates = false;

                // Loop to identify the first bench
                for (; aggID <
                         newAggregateRegister[nextLoop].size(); ++aggID)
                {
                    const AggRegTuple& regTuple = newAggregateRegister[nextLoop][aggID];
        
                    if (regTuple.postLoopAgg)
                    {
                        mapAggregateToIndexes(aggIdx,regTuple,depth,nextLoop);

                        // Increment the counter and update the remapping array
                        newAggregateRemapping[depth][nextLoop][aggID] = aggregateCounter;
                        ++aggregateCounter;

                        ++aggID; // TODO: Make sure that this is necessary!!
                        addedAggregates = true;
                        break;
                    }
                }   
            
                // Loop over all other aggregates 
                for (; aggID <
                         newAggregateRegister[nextLoop].size(); ++aggID)
                {
                    const AggRegTuple& regTuple = newAggregateRegister[nextLoop][aggID];
        
                    if (regTuple.postLoopAgg)
                    {
                        aggIdx.reset();
                    
                        mapAggregateToIndexes(aggIdx,regTuple,depth,nextLoop);

                        if (aggIdx.isIncrement(bench,off,increasingIndexes))
                        {
                            ++off;
                        }
                        else
                        {
                            // If not, output bench and all offset aggregates
                            returnString += outputAggRegTupleString(
                                bench,off,increasingIndexes, 3+depth+numOfLoops,true);
                        
                            // make aggregate the bench and set offset to 0
                            bench = aggIdx;
                            off = 0;
                        }

                        // Increment the counter and update the remapping array
                        newAggregateRemapping[depth][nextLoop][aggID] = aggregateCounter;
                        ++aggregateCounter;
                    }
                }

                // Output bench -- and any further aggregates (if there were any)
                if (addedAggregates)
                    returnString += outputAggRegTupleString(
                        bench,off,increasingIndexes,3+depth+numOfLoops,true);
            }
            else
            {
                // here we output the aggregates uncompressed -TODO: we could probably
                // remove this and incorporate it in the previous part
            
                // After recurse, add the aggregates that have been added with post FLAG
                for (size_t aggID = 0; aggID <
                         newAggregateRegister[nextLoop].size(); ++aggID)
                {
                    const AggRegTuple& regTuple = newAggregateRegister[nextLoop][aggID];
        
                    if (regTuple.postLoopAgg)
                    {
                        // We use a mapping to the correct index
                        returnString += offset(3+depth+numOfLoops)+
                            "aggregateRegister["+std::to_string(aggregateCounter)+"] = ";

                        if (regTuple.previous.first < listOfLoops.size())
                        {
                            std::string local = std::to_string(
                                newAggregateRemapping[depth]
                                [regTuple.previous.first]
                                [regTuple.previous.second]);
                            returnString += "aggregateRegister["+local+"]*";
                        }

                        if (regTuple.postLoop.first < listOfLoops.size())
                        {
                            std::string post = std::to_string(
                                newAggregateRemapping[depth][regTuple.postLoop.first]
                                [regTuple.postLoop.second]); 
                            returnString += "aggregateRegister["+post+"]*";
                        }
                        
                        returnString.pop_back();
                        returnString += ";\n";
            
                        // Increment the counter and update the remapping array
                        newAggregateRemapping[depth][nextLoop][aggID] = aggregateCounter;
                        ++aggregateCounter;
                    }
                }
            }
        }
        else break;
    }
    
    size_t startingOffset = aggregateCounter;
    
    if (COMPRESS_AGGREGATES)
    {        
        // After recurse, add the aggregates that have been added with post FLAG
        AggregateIndexes bench, aggIdx;
        std::bitset<7> increasingIndexes;
        size_t aggID = 0, off = 0;
    
        bool addedAggregates = false;

        // Loop to identify the first bench
        for (; aggID < newAggregateRegister[thisLoopID].size(); ++aggID)
        {
            const AggRegTuple& regTuple = newAggregateRegister[thisLoopID][aggID];
        
            if (!regTuple.postLoopAgg)
            {
                mapAggregateToIndexes
                    (bench,newAggregateRegister[thisLoopID][aggID],depth,thisLoopID);
            
                addedAggregates = true;

                // Increment the counter and update the remapping array
                newAggregateRemapping[depth][thisLoopID][aggID] = aggregateCounter;
                ++aggregateCounter;

                ++aggID;
                break;
            }
        }

        // Loop over all other aggregates 
        for (; aggID < newAggregateRegister[thisLoopID].size(); ++aggID)
        {
            const AggRegTuple& regTuple = newAggregateRegister[thisLoopID][aggID];
        
            if (!regTuple.postLoopAgg)
            {
                aggIdx.reset();
            
                mapAggregateToIndexes
                    (aggIdx,newAggregateRegister[thisLoopID][aggID],depth,thisLoopID);

                if (aggIdx.isIncrement(bench,off,increasingIndexes))
                {
                    ++off;
                }
                else
                {
                    // If not, output bench and all offset aggregates
                    returnString += outputAggRegTupleString(bench,off,increasingIndexes,
                                                            3+depth+numOfLoops,false);
                
                    // make aggregate the bench and set offset to 0
                    bench = aggIdx;
                    off = 0;
                }

                // Increment the counter and update the remapping array
                newAggregateRemapping[depth][thisLoopID][aggID] = aggregateCounter;
                ++aggregateCounter;
            }
        }

        // Output bench -- and any further aggregates (if there were any)
        if (addedAggregates)
            returnString += outputAggRegTupleString(
                bench,off,increasingIndexes,3+depth+numOfLoops,false);
    }
    else
    {
        
        for (size_t aggID = 0; aggID < newAggregateRegister[thisLoopID].size(); ++aggID)
        {
            const AggRegTuple& regTuple = newAggregateRegister[thisLoopID][aggID];
        
            if (!regTuple.postLoopAgg)
            {
                // We use a mapping to the correct index
                returnString += offset(3+depth+numOfLoops)+
                    "aggregateRegister["+std::to_string(aggregateCounter)+"] += ";

                if (regTuple.previous.first < listOfLoops.size())
                {
                    std::string prev = std::to_string(
                        newAggregateRemapping[regTuple.prevDepth]
                        [regTuple.previous.first]
                        [regTuple.previous.second]);
                
                    returnString += "aggregateRegister["+prev+"]*";
                }
            
                if (regTuple.product.first)
                {
                    std::string local = std::to_string(
                        localProductRemapping[thisLoopID][regTuple.product.second]
                        );
                    returnString += "localRegister["+local+"]*";
                }
        
                if (regTuple.newViewProduct)
                {
                    std::string view = std::to_string(
                        viewProductRemapping[thisLoopID][regTuple.viewAgg.second]);
                    returnString += "viewRegister["+view+"];";
                }
                else if (regTuple.singleViewAgg)
                {
                    returnString += "aggregates_"+viewName[regTuple.viewAgg.first]+"["+
                        std::to_string(regTuple.viewAgg.second)+"]*";
                }
            
                if (regTuple.multiplyByCount)
                    returnString +=  "count*";

                if (regTuple.postLoop.first < listOfLoops.size())
                {
                    std::string postLoop = std::to_string(
                        newAggregateRemapping[depth][regTuple.postLoop.first]
                        [regTuple.postLoop.second]);
                    returnString += "aggregateRegister["+postLoop+"]*";
                }
            
                returnString.pop_back();
                returnString += ";\n";
            
                // Increment the counter and update the remapping array
                newAggregateRemapping[depth][thisLoopID][aggID] = aggregateCounter;
                ++aggregateCounter;
            }
        }
    }
    

    if (aggregateCounter > startingOffset)
    {
        size_t resetOffset = (numOfLoops == 0 ? 3+depth : 2+depth+numOfLoops);
        resetString += offset(resetOffset)+"memset(&aggregateRegister["+
            std::to_string(startingOffset)+"], 0, sizeof(double) * "+
            std::to_string(aggregateCounter-startingOffset)+");\n";
    }
    
    return returnString;
}